

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O3

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::buildDualProblem(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *dualLP,SPxRowId *primalRowIds,SPxColId *primalColIds,SPxRowId *dualRowIds,
                  SPxColId *dualColIds,int *nprimalrows,int *nprimalcols,int *ndualrows,
                  int *ndualcols)

{
  DataKey *pDVar1;
  byte bVar2;
  pointer pnVar3;
  Tolerances *pTVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  Item *pIVar6;
  int iVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [16];
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar11;
  fpclass_type fVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  bool bVar15;
  int iVar16;
  Type TVar17;
  undefined8 *puVar18;
  long lVar19;
  int iVar20;
  ulong uVar21;
  uint *puVar22;
  undefined4 *puVar23;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar24;
  undefined4 *puVar25;
  long lVar26;
  ulong uVar27;
  uint uVar28;
  long in_FS_OFFSET;
  byte bVar29;
  Real RVar30;
  int numdualrows;
  int numdualcols;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  int numprimalcols;
  int numprimalrows;
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  dualcols;
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  dualrows;
  DataKey local_6ac;
  int local_6a4;
  ulong local_6a0;
  undefined1 local_698 [8];
  SPxRowId *pSStack_690;
  undefined1 local_688 [16];
  undefined1 local_678 [16];
  undefined1 local_668 [16];
  undefined1 local_658 [16];
  undefined1 local_648 [16];
  uint local_638 [3];
  undefined3 uStack_62b;
  undefined5 uStack_628;
  undefined8 local_620;
  undefined1 local_618 [8];
  SPxColId *pSStack_610;
  undefined1 local_608 [16];
  undefined1 local_5f8 [16];
  undefined1 local_5e8 [16];
  undefined1 local_5d8 [16];
  undefined1 local_5c8 [16];
  uint local_5b8 [3];
  undefined3 uStack_5ab;
  int iStack_5a8;
  bool bStack_5a4;
  undefined8 local_5a0;
  double local_598;
  undefined8 uStack_590;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_588;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_580;
  double local_578;
  undefined8 uStack_570;
  double local_568;
  undefined8 uStack_560;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_558;
  SPxRowId *local_550;
  undefined1 local_548 [8];
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_540;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_530;
  fpclass_type local_528;
  int32_t iStack_524;
  undefined8 uStack_520;
  cpp_dec_float<200U,_int,_void> local_510;
  SPxColId *local_490;
  SPxColId *local_488;
  undefined1 local_480 [8];
  SPxColId *local_478;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_470;
  undefined1 local_3b8 [8];
  SPxRowId *local_3b0;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_3a8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2f0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_270;
  undefined4 local_1f0 [28];
  undefined4 local_180 [28];
  undefined4 local_110 [28];
  undefined4 local_a0 [28];
  
  bVar29 = 0;
  local_558 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)dualRowIds;
  local_550 = primalRowIds;
  local_490 = primalColIds;
  local_488 = dualColIds;
  if ((dualRowIds == (SPxRowId *)0x0 ||
      (primalColIds == (SPxColId *)0x0 || primalRowIds == (SPxRowId *)0x0)) ||
      dualColIds == (SPxColId *)0x0) {
    iVar16 = (this->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thenum;
    local_3b8._0_4_ = iVar16 * 2;
    local_3b0 = (SPxRowId *)0x0;
    local_3a8 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x3ff3333333333333;
    iVar20 = 0;
    if ((int)local_3b8._0_4_ < 1) {
      local_3b8._0_4_ = iVar20;
    }
    local_3b8._4_4_ = local_3b8._0_4_;
    if (iVar16 < 1) {
      local_3b8._4_4_ = 1;
    }
    spx_alloc<soplex::SPxRowId*>(&local_3b0,local_3b8._4_4_);
    iVar16 = (this->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thenum;
    local_480._0_4_ = iVar16 * 2;
    local_478 = (SPxColId *)0x0;
    local_470 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x3ff3333333333333;
    if ((int)local_480._0_4_ < 1) {
      local_480._0_4_ = iVar20;
    }
    local_480._4_4_ = local_480._0_4_;
    if (iVar16 < 1) {
      local_480._4_4_ = 1;
    }
    spx_alloc<soplex::SPxColId*>(&local_478,local_480._4_4_);
    iVar16 = (this->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thenum;
    iVar7 = iVar16 * 2;
    local_688._0_8_ = 0x3ff3333333333333;
    if (0 < iVar7) {
      iVar20 = iVar7;
    }
    local_698._4_4_ = iVar20;
    if (iVar16 < 1) {
      local_698._4_4_ = 1;
    }
    local_698._0_4_ = iVar20;
    pSStack_690 = (SPxRowId *)0x0;
    spx_alloc<soplex::SPxRowId*>((SPxRowId **)(local_698 + 8),local_698._4_4_);
    iVar16 = (this->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thenum;
    local_618._0_4_ = iVar16 * 2;
    local_608._0_8_ = 0x3ff3333333333333;
    if ((int)local_618._0_4_ < 1) {
      local_618._0_4_ = 0;
    }
    local_618._4_4_ = 1;
    if (0 < iVar16) {
      local_618._4_4_ = local_618._0_4_;
    }
    pSStack_610 = (SPxColId *)0x0;
    spx_alloc<soplex::SPxColId*>((SPxColId **)(local_618 + 8),local_618._4_4_);
    local_510.data._M_elems._0_8_ = (ulong)local_510.data._M_elems[1] << 0x20;
    local_548 = (undefined1  [8])((ulong)(uint)local_548._4_4_ << 0x20);
    local_6ac = (DataKey)((ulong)(uint)local_6ac.idx << 0x20);
    local_6a4 = 0;
    (*(this->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x4b])
              (this,dualLP,local_3b0,local_478,pSStack_690,pSStack_610,&local_510,local_548,
               &local_6ac,&local_6a4);
    if (local_550 != (SPxRowId *)0x0) {
      *nprimalrows = local_510.data._M_elems[0];
    }
    if (local_490 != (SPxColId *)0x0) {
      *nprimalcols = local_548._0_4_;
    }
    if (local_558 !=
        (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
         *)0x0) {
      *ndualrows = local_6ac.info;
    }
    if (local_488 != (SPxColId *)0x0) {
      *ndualcols = local_6a4;
    }
    if (pSStack_610 != (SPxColId *)0x0) {
      free(pSStack_610);
    }
    if (pSStack_690 != (SPxRowId *)0x0) {
      free(pSStack_690);
    }
    if (local_478 != (SPxColId *)0x0) {
      free(local_478);
    }
    if (local_3b0 != (SPxRowId *)0x0) {
      free(local_3b0);
    }
  }
  else {
    (*(dualLP->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x45])(dualLP,(ulong)((uint)(this->thesense == MINIMIZE) * 2 - 1));
    LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::LPRowSetBase((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)local_3b8,
                   (this->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum,-1);
    LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::LPColSetBase((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)local_480,
                   (this->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum,-1);
    local_540.m_elem =
         (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)0x0;
    local_540.memsize = 0;
    local_540.memused = 0;
    local_548 = (undefined1  [8])&PTR__DSVectorBase_006a69e0;
    local_530 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x0;
    DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::allocMem((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)local_548,1);
    local_580 = dualLP;
    if ((this->
        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .set.thenum < 1) {
      uVar27 = 0;
      local_6a0 = 0;
    }
    else {
      local_568 = *(double *)(in_FS_OFFSET + -8);
      uStack_560 = 0;
      local_578 = -local_568;
      uStack_570 = 0x8000000000000000;
      lVar26 = 0;
      uVar27 = 0;
      local_598 = (double)((ulong)local_598 & 0xffffffff00000000);
      do {
        pDVar1 = (this->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thekey + uVar27;
        local_618._0_4_ = pDVar1->info;
        local_618._4_4_ = pDVar1->idx;
        SPxColId::SPxColId((SPxColId *)local_698,(DataKey *)local_618);
        auVar10 = _local_698;
        local_490[uVar27].super_DataKey.info = local_698._0_4_;
        local_490[uVar27].super_DataKey.idx = local_698._4_4_;
        pnVar3 = (this->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).low.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_6a0 = uVar27;
        _local_698 = auVar10;
        ::soplex::infinity::__tls_init();
        local_620._0_4_ = cpp_dec_float_finite;
        local_620._4_4_ = 0x1c;
        _local_698 = (undefined1  [16])0x0;
        local_688 = (undefined1  [16])0x0;
        local_678 = (undefined1  [16])0x0;
        local_668 = (undefined1  [16])0x0;
        local_658 = (undefined1  [16])0x0;
        local_648 = (undefined1  [16])0x0;
        local_638[0] = 0;
        local_638[1] = 0;
        stack0xfffffffffffff9d0 = 0;
        uStack_62b = 0;
        uStack_628._0_4_ = 0;
        uStack_628._4_1_ = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_698,local_578);
        if (((*(int *)((long)(&(pnVar3->m_backend).data + 1) + lVar26 + 8U) == 2) ||
            ((fpclass_type)local_620 == cpp_dec_float_NaN)) ||
           (iVar16 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)
                                ((long)(pnVar3->m_backend).data._M_elems + lVar26),
                                (cpp_dec_float<200U,_int,_void> *)local_698), 0 < iVar16)) {
LAB_004d101b:
          pnVar3 = (this->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).low.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ::soplex::infinity::__tls_init();
          local_620._0_4_ = cpp_dec_float_finite;
          local_620._4_4_ = 0x1c;
          _local_698 = (undefined1  [16])0x0;
          local_688 = (undefined1  [16])0x0;
          local_678 = (undefined1  [16])0x0;
          local_668 = (undefined1  [16])0x0;
          local_658 = (undefined1  [16])0x0;
          local_648 = (undefined1  [16])0x0;
          local_638[0] = 0;
          local_638[1] = 0;
          stack0xfffffffffffff9d0 = 0;
          uStack_62b = 0;
          uStack_628._0_4_ = 0;
          uStack_628._4_1_ = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)local_698,local_578);
          if (((*(int *)((long)(&(pnVar3->m_backend).data + 1) + lVar26 + 8U) == 2) ||
              ((fpclass_type)local_620 == cpp_dec_float_NaN)) ||
             (iVar16 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)
                                  ((long)(pnVar3->m_backend).data._M_elems + lVar26),
                                  (cpp_dec_float<200U,_int,_void> *)local_698), 0 < iVar16)) {
            pnVar3 = (this->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).up.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            ::soplex::infinity::__tls_init();
            local_620._0_4_ = cpp_dec_float_finite;
            local_620._4_4_ = 0x1c;
            _local_698 = ZEXT816(0);
            local_688 = ZEXT816(0);
            local_678 = ZEXT816(0);
            local_668 = ZEXT816(0);
            local_658 = ZEXT816(0);
            local_648 = ZEXT816(0);
            local_638[0] = 0;
            local_638[1] = 0;
            stack0xfffffffffffff9d0 = 0;
            uStack_62b = 0;
            uStack_628._0_4_ = 0;
            uStack_628._4_1_ = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)local_698,local_568);
            if (((*(int *)((long)(&(pnVar3->m_backend).data + 1) + lVar26 + 8U) == 2) ||
                ((fpclass_type)local_620 == cpp_dec_float_NaN)) ||
               (iVar16 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   ((cpp_dec_float<200U,_int,_void> *)
                                    ((long)(pnVar3->m_backend).data._M_elems + lVar26),
                                    (cpp_dec_float<200U,_int,_void> *)local_698), iVar16 < 0)) {
              pnVar3 = (this->
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).low.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              puVar22 = (uint *)((long)(pnVar3->m_backend).data._M_elems + lVar26);
              pnVar24 = &local_270;
              for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
                (pnVar24->m_backend).data._M_elems[0] = *puVar22;
                puVar22 = puVar22 + (ulong)bVar29 * -2 + 1;
                pnVar24 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar24 + ((ulong)bVar29 * -2 + 1) * 4);
              }
              local_270.m_backend.exp = *(int *)((long)(&(pnVar3->m_backend).data + 1) + lVar26);
              local_270.m_backend.neg =
                   *(bool *)((long)(&(pnVar3->m_backend).data + 1) + lVar26 + 4U);
              local_270.m_backend._120_8_ =
                   *(undefined8 *)((long)(&(pnVar3->m_backend).data + 1) + lVar26 + 8U);
              pnVar3 = (this->
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).up.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              puVar22 = (uint *)((long)(pnVar3->m_backend).data._M_elems + lVar26);
              pnVar24 = &local_2f0;
              for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
                (pnVar24->m_backend).data._M_elems[0] = *puVar22;
                puVar22 = puVar22 + (ulong)bVar29 * -2 + 1;
                pnVar24 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar24 + ((ulong)bVar29 * -2 + 1) * 4);
              }
              local_2f0.m_backend.exp = *(int *)((long)(&(pnVar3->m_backend).data + 1) + lVar26);
              local_2f0.m_backend.neg =
                   *(bool *)((long)(&(pnVar3->m_backend).data + 1) + lVar26 + 4U);
              local_2f0.m_backend._120_8_ =
                   *(undefined8 *)((long)(&(pnVar3->m_backend).data + 1) + lVar26 + 8U);
              pTVar4 = (this->_tolerances).
                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              p_Var5 = (this->_tolerances).
                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
              if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
                }
              }
              RVar30 = Tolerances::epsilon(pTVar4);
              bVar15 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                                 (&local_270,&local_2f0,RVar30);
              if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
              }
              if (bVar15) {
                pnVar3 = (this->
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).low.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                puVar23 = (undefined4 *)((long)(pnVar3->m_backend).data._M_elems + lVar26);
                puVar25 = local_180;
                for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
                  *puVar25 = *puVar23;
                  puVar23 = puVar23 + (ulong)bVar29 * -2 + 1;
                  puVar25 = puVar25 + (ulong)bVar29 * -2 + 1;
                }
                iVar16 = *(int *)((long)(&(pnVar3->m_backend).data + 1) + lVar26);
                bVar2 = *(byte *)((long)(&(pnVar3->m_backend).data + 1) + lVar26 + 4U);
                _local_528 = *(undefined8 *)((long)(&(pnVar3->m_backend).data + 1) + lVar26 + 8U);
                uStack_520 = 0;
                pTVar4 = (this->_tolerances).
                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                p_Var5 = (this->_tolerances).
                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
                if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
                  }
                }
                RVar30 = Tolerances::epsilon(pTVar4);
                puVar23 = local_180;
                puVar25 = (undefined4 *)local_618;
                for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
                  *puVar25 = *puVar23;
                  puVar23 = puVar23 + (ulong)bVar29 * -2 + 1;
                  puVar25 = puVar25 + (ulong)bVar29 * -2 + 1;
                }
                fVar12 = local_528;
                uVar8._0_4_ = local_528;
                uVar8._4_4_ = iStack_524;
                local_5a0._0_4_ = local_528;
                local_5a0._4_4_ = iStack_524;
                bStack_5a4 = (bool)bVar2;
                if ((bVar2 != 0) && (local_618._0_4_ != 0 || fVar12 != cpp_dec_float_finite)) {
                  bStack_5a4 = (bool)(bVar2 ^ 1);
                }
                bVar15 = false;
                iStack_5a8 = iVar16;
                uVar13 = uVar8;
                if ((fVar12 != cpp_dec_float_NaN) && (uVar13 = local_5a0, !NAN(RVar30))) {
                  local_620._0_4_ = cpp_dec_float_finite;
                  local_620._4_4_ = 0x1c;
                  _local_698 = (undefined1  [16])0x0;
                  local_688 = (undefined1  [16])0x0;
                  local_678 = (undefined1  [16])0x0;
                  local_668 = (undefined1  [16])0x0;
                  local_658 = (undefined1  [16])0x0;
                  local_648 = (undefined1  [16])0x0;
                  local_638[0] = 0;
                  local_638[1] = 0;
                  stack0xfffffffffffff9d0 = 0;
                  uStack_62b = 0;
                  uStack_628._0_4_ = 0;
                  uStack_628._4_1_ = false;
                  local_5a0 = uVar8;
                  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                            ((cpp_dec_float<200u,int,void> *)local_698,RVar30);
                  iVar16 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                     ((cpp_dec_float<200U,_int,_void> *)local_618,
                                      (cpp_dec_float<200U,_int,_void> *)local_698);
                  bVar15 = iVar16 < 1;
                  uVar13 = local_5a0;
                }
                local_5a0 = uVar13;
                if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
                }
                if (bVar15) {
                  local_620._0_4_ = cpp_dec_float_finite;
                  local_620._4_4_ = 0x1c;
                  _local_698 = ZEXT816(0);
                  local_688 = ZEXT816(0);
                  local_678 = ZEXT816(0);
                  local_668 = ZEXT816(0);
                  local_658 = ZEXT816(0);
                  local_648 = ZEXT816(0);
                  local_638[0] = 0;
                  local_638[1] = 0;
                  stack0xfffffffffffff9d0 = 0;
                  uStack_62b = 0;
                  uStack_628._0_4_ = 0;
                  uStack_628._4_1_ = false;
                  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                            ((cpp_dec_float<200u,int,void> *)local_698,1.0);
                  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::add((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)local_548,(int)local_6a0,
                        (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)local_698);
                  if (this->thesense == MINIMIZE) {
                    ::soplex::infinity::__tls_init();
                    local_620._0_4_ = cpp_dec_float_finite;
                    local_620._4_4_ = 0x1c;
                    _local_698 = ZEXT816(0);
                    local_688 = ZEXT816(0);
                    local_678 = ZEXT816(0);
                    local_668 = ZEXT816(0);
                    local_658 = ZEXT816(0);
                    local_648 = ZEXT816(0);
                    local_638[0] = 0;
                    local_638[1] = 0;
                    stack0xfffffffffffff9d0 = 0;
                    uStack_62b = 0;
                    uStack_628._0_4_ = 0;
                    uStack_628._4_1_ = false;
                    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                              ((cpp_dec_float<200u,int,void> *)local_698,local_578);
                    obj((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)local_618,this,(int)local_6a0);
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                    cpp_dec_float<long_long>(&local_510,0,(type *)0x0);
                    local_6a4 = 0;
                    local_6ac.info = 0;
                    local_6ac.idx = -1;
                    LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::create((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)local_3b8,&local_6ac,0,
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)local_698,
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)local_618,
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_510,&local_6a4);
                    pnVar3 = (this->
                             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).up.val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    ::soplex::infinity::__tls_init();
                    local_620._0_4_ = cpp_dec_float_finite;
                    local_620._4_4_ = 0x1c;
                    _local_698 = ZEXT816(0);
                    local_688 = ZEXT816(0);
                    local_678 = ZEXT816(0);
                    local_668 = ZEXT816(0);
                    local_658 = ZEXT816(0);
                    local_648 = ZEXT816(0);
                    local_638[0] = 0;
                    local_638[1] = 0;
                    stack0xfffffffffffff9d0 = 0;
                    uStack_62b = 0;
                    uStack_628._0_4_ = 0;
                    uStack_628._4_1_ = false;
                    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                              ((cpp_dec_float<200u,int,void> *)local_698,local_578);
                    local_5a0._0_4_ = cpp_dec_float_finite;
                    local_5a0._4_4_ = 0x1c;
                    _local_618 = (undefined1  [16])0x0;
                    local_608 = (undefined1  [16])0x0;
                    local_5f8 = (undefined1  [16])0x0;
                    local_5e8 = (undefined1  [16])0x0;
                    local_5d8 = (undefined1  [16])0x0;
                    local_5c8 = (undefined1  [16])0x0;
                    local_5b8[0] = 0;
                    local_5b8[1] = 0;
                    stack0xfffffffffffffa50 = 0;
                    uStack_5ab = 0;
                    iStack_5a8 = 0;
                    bStack_5a4 = false;
                    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                              ((cpp_dec_float<200u,int,void> *)local_618,0.0);
                    local_6ac = (DataKey)((ulong)local_6ac & 0xffffffff00000000);
                    local_510.data._M_elems[0] = 0;
                    local_510.data._M_elems[1] = 0xffffffff;
                    LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::add((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)local_480,(DataKey *)&local_510,
                          (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)(pnVar3->m_backend).data._M_elems + lVar26),
                          (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)local_698,&local_540,
                          (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)local_618,&local_6ac.info);
                  }
                  else {
                    obj((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)local_698,this,(int)local_6a0);
                    ::soplex::infinity::__tls_init();
                    local_5a0._0_4_ = cpp_dec_float_finite;
                    local_5a0._4_4_ = 0x1c;
                    _local_618 = ZEXT816(0);
                    local_608 = ZEXT816(0);
                    local_5f8 = ZEXT816(0);
                    local_5e8 = ZEXT816(0);
                    local_5d8 = ZEXT816(0);
                    local_5c8 = ZEXT816(0);
                    local_5b8[0] = 0;
                    local_5b8[1] = 0;
                    stack0xfffffffffffffa50 = 0;
                    uStack_5ab = 0;
                    iStack_5a8 = 0;
                    bStack_5a4 = false;
                    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                              ((cpp_dec_float<200u,int,void> *)local_618,local_568);
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                    cpp_dec_float<long_long>(&local_510,0,(type *)0x0);
                    local_6a4 = 0;
                    local_6ac.info = 0;
                    local_6ac.idx = -1;
                    LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::create((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)local_3b8,&local_6ac,0,
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)local_698,
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)local_618,
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_510,&local_6a4);
                    pnVar3 = (this->
                             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).up.val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    local_620._0_4_ = cpp_dec_float_finite;
                    local_620._4_4_ = 0x1c;
                    _local_698 = ZEXT816(0);
                    local_688 = ZEXT816(0);
                    local_678 = ZEXT816(0);
                    local_668 = ZEXT816(0);
                    local_658 = ZEXT816(0);
                    local_648 = ZEXT816(0);
                    local_638[0] = 0;
                    local_638[1] = 0;
                    stack0xfffffffffffff9d0 = 0;
                    uStack_62b = 0;
                    uStack_628._0_4_ = 0;
                    uStack_628._4_1_ = false;
                    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                              ((cpp_dec_float<200u,int,void> *)local_698,0.0);
                    ::soplex::infinity::__tls_init();
                    local_5a0._0_4_ = cpp_dec_float_finite;
                    local_5a0._4_4_ = 0x1c;
                    _local_618 = ZEXT816(0);
                    local_608 = ZEXT816(0);
                    local_5f8 = ZEXT816(0);
                    local_5e8 = ZEXT816(0);
                    local_5d8 = ZEXT816(0);
                    local_5c8 = ZEXT816(0);
                    local_5b8[0] = 0;
                    local_5b8[1] = 0;
                    stack0xfffffffffffffa50 = 0;
                    uStack_5ab = 0;
                    iStack_5a8 = 0;
                    bStack_5a4 = false;
                    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                              ((cpp_dec_float<200u,int,void> *)local_618,local_568);
                    local_6ac = (DataKey)((ulong)local_6ac & 0xffffffff00000000);
                    local_510.data._M_elems[0] = 0;
                    local_510.data._M_elems[1] = 0xffffffff;
                    LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::add((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)local_480,(DataKey *)&local_510,
                          (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)(pnVar3->m_backend).data._M_elems + lVar26),
                          (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)local_698,&local_540,
                          (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)local_618,&local_6ac.info);
                  }
LAB_004d33fd:
                  iVar16 = local_598._0_4_ + 1;
                }
                else {
                  pnVar3 = (this->
                           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).up.val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  puVar23 = (undefined4 *)((long)(pnVar3->m_backend).data._M_elems + lVar26);
                  puVar25 = local_1f0;
                  for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
                    *puVar25 = *puVar23;
                    puVar23 = puVar23 + (ulong)bVar29 * -2 + 1;
                    puVar25 = puVar25 + (ulong)bVar29 * -2 + 1;
                  }
                  iVar16 = *(int *)((long)(&(pnVar3->m_backend).data + 1) + lVar26);
                  bVar2 = *(byte *)((long)(&(pnVar3->m_backend).data + 1) + lVar26 + 4U);
                  _local_528 = *(undefined8 *)((long)(&(pnVar3->m_backend).data + 1) + lVar26 + 8U);
                  uStack_520 = 0;
                  pTVar4 = (this->_tolerances).
                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  ;
                  p_Var5 = (this->_tolerances).
                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi;
                  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
                    }
                  }
                  RVar30 = Tolerances::epsilon(pTVar4);
                  puVar23 = local_1f0;
                  puVar25 = (undefined4 *)local_618;
                  for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
                    *puVar25 = *puVar23;
                    puVar23 = puVar23 + (ulong)bVar29 * -2 + 1;
                    puVar25 = puVar25 + (ulong)bVar29 * -2 + 1;
                  }
                  fVar12 = local_528;
                  uVar9._0_4_ = local_528;
                  uVar9._4_4_ = iStack_524;
                  local_5a0._0_4_ = local_528;
                  local_5a0._4_4_ = iStack_524;
                  bStack_5a4 = (bool)bVar2;
                  if ((bVar2 != 0) && (local_618._0_4_ != 0 || fVar12 != cpp_dec_float_finite)) {
                    bStack_5a4 = (bool)(bVar2 ^ 1);
                  }
                  bVar15 = false;
                  iStack_5a8 = iVar16;
                  uVar13 = uVar9;
                  if ((fVar12 != cpp_dec_float_NaN) && (uVar13 = local_5a0, !NAN(RVar30))) {
                    local_620._0_4_ = cpp_dec_float_finite;
                    local_620._4_4_ = 0x1c;
                    _local_698 = (undefined1  [16])0x0;
                    local_688 = (undefined1  [16])0x0;
                    local_678 = (undefined1  [16])0x0;
                    local_668 = (undefined1  [16])0x0;
                    local_658 = (undefined1  [16])0x0;
                    local_648 = (undefined1  [16])0x0;
                    local_638[0] = 0;
                    local_638[1] = 0;
                    stack0xfffffffffffff9d0 = 0;
                    uStack_62b = 0;
                    uStack_628._0_4_ = 0;
                    uStack_628._4_1_ = false;
                    local_5a0 = uVar9;
                    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                              ((cpp_dec_float<200u,int,void> *)local_698,RVar30);
                    iVar16 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                             compare((cpp_dec_float<200U,_int,_void> *)local_618,
                                     (cpp_dec_float<200U,_int,_void> *)local_698);
                    bVar15 = iVar16 < 1;
                    uVar13 = local_5a0;
                  }
                  local_5a0 = uVar13;
                  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
                  }
                  if (bVar15) {
                    local_620._0_4_ = cpp_dec_float_finite;
                    local_620._4_4_ = 0x1c;
                    _local_698 = ZEXT816(0);
                    local_688 = ZEXT816(0);
                    local_678 = ZEXT816(0);
                    local_668 = ZEXT816(0);
                    local_658 = ZEXT816(0);
                    local_648 = ZEXT816(0);
                    local_638[0] = 0;
                    local_638[1] = 0;
                    stack0xfffffffffffff9d0 = 0;
                    uStack_62b = 0;
                    uStack_628._0_4_ = 0;
                    uStack_628._4_1_ = false;
                    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                              ((cpp_dec_float<200u,int,void> *)local_698,1.0);
                    DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::add((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)local_548,(int)local_6a0,
                          (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)local_698);
                    if (this->thesense == MINIMIZE) {
                      obj((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)local_698,this,(int)local_6a0);
                      ::soplex::infinity::__tls_init();
                      local_5a0._0_4_ = cpp_dec_float_finite;
                      local_5a0._4_4_ = 0x1c;
                      _local_618 = ZEXT816(0);
                      local_608 = ZEXT816(0);
                      local_5f8 = ZEXT816(0);
                      local_5e8 = ZEXT816(0);
                      local_5d8 = ZEXT816(0);
                      local_5c8 = ZEXT816(0);
                      local_5b8[0] = 0;
                      local_5b8[1] = 0;
                      stack0xfffffffffffffa50 = 0;
                      uStack_5ab = 0;
                      iStack_5a8 = 0;
                      bStack_5a4 = false;
                      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                                ((cpp_dec_float<200u,int,void> *)local_618,local_568);
                      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                      cpp_dec_float<long_long>(&local_510,0,(type *)0x0);
                      local_6a4 = 0;
                      local_6ac.info = 0;
                      local_6ac.idx = -1;
                      LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::create((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)local_3b8,&local_6ac,0,
                               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)local_698,
                               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)local_618,
                               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&local_510,&local_6a4);
                      pnVar3 = (this->
                               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).low.val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                      local_620._0_4_ = cpp_dec_float_finite;
                      local_620._4_4_ = 0x1c;
                      _local_698 = ZEXT816(0);
                      local_688 = ZEXT816(0);
                      local_678 = ZEXT816(0);
                      local_668 = ZEXT816(0);
                      local_658 = ZEXT816(0);
                      local_648 = ZEXT816(0);
                      local_638[0] = 0;
                      local_638[1] = 0;
                      stack0xfffffffffffff9d0 = 0;
                      uStack_62b = 0;
                      uStack_628._0_4_ = 0;
                      uStack_628._4_1_ = false;
                      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                                ((cpp_dec_float<200u,int,void> *)local_698,0.0);
                      ::soplex::infinity::__tls_init();
                      local_5a0._0_4_ = cpp_dec_float_finite;
                      local_5a0._4_4_ = 0x1c;
                      _local_618 = ZEXT816(0);
                      local_608 = ZEXT816(0);
                      local_5f8 = ZEXT816(0);
                      local_5e8 = ZEXT816(0);
                      local_5d8 = ZEXT816(0);
                      local_5c8 = ZEXT816(0);
                      local_5b8[0] = 0;
                      local_5b8[1] = 0;
                      stack0xfffffffffffffa50 = 0;
                      uStack_5ab = 0;
                      iStack_5a8 = 0;
                      bStack_5a4 = false;
                      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                                ((cpp_dec_float<200u,int,void> *)local_618,local_568);
                      local_6ac = (DataKey)((ulong)local_6ac & 0xffffffff00000000);
                      local_510.data._M_elems[0] = 0;
                      local_510.data._M_elems[1] = 0xffffffff;
                      LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::add((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)local_480,(DataKey *)&local_510,
                            (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)(pnVar3->m_backend).data._M_elems + lVar26),
                            (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)local_698,&local_540,
                            (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)local_618,&local_6ac.info);
                    }
                    else {
                      ::soplex::infinity::__tls_init();
                      local_620._0_4_ = cpp_dec_float_finite;
                      local_620._4_4_ = 0x1c;
                      _local_698 = ZEXT816(0);
                      local_688 = ZEXT816(0);
                      local_678 = ZEXT816(0);
                      local_668 = ZEXT816(0);
                      local_658 = ZEXT816(0);
                      local_648 = ZEXT816(0);
                      local_638[0] = 0;
                      local_638[1] = 0;
                      stack0xfffffffffffff9d0 = 0;
                      uStack_62b = 0;
                      uStack_628._0_4_ = 0;
                      uStack_628._4_1_ = false;
                      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                                ((cpp_dec_float<200u,int,void> *)local_698,local_578);
                      obj((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)local_618,this,(int)local_6a0);
                      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                      cpp_dec_float<long_long>(&local_510,0,(type *)0x0);
                      local_6a4 = 0;
                      local_6ac.info = 0;
                      local_6ac.idx = -1;
                      LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::create((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)local_3b8,&local_6ac,0,
                               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)local_698,
                               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)local_618,
                               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&local_510,&local_6a4);
                      pnVar3 = (this->
                               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).low.val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                      ::soplex::infinity::__tls_init();
                      local_620._0_4_ = cpp_dec_float_finite;
                      local_620._4_4_ = 0x1c;
                      _local_698 = ZEXT816(0);
                      local_688 = ZEXT816(0);
                      local_678 = ZEXT816(0);
                      local_668 = ZEXT816(0);
                      local_658 = ZEXT816(0);
                      local_648 = ZEXT816(0);
                      local_638[0] = 0;
                      local_638[1] = 0;
                      stack0xfffffffffffff9d0 = 0;
                      uStack_62b = 0;
                      uStack_628._0_4_ = 0;
                      uStack_628._4_1_ = false;
                      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                                ((cpp_dec_float<200u,int,void> *)local_698,local_578);
                      local_5a0._0_4_ = cpp_dec_float_finite;
                      local_5a0._4_4_ = 0x1c;
                      _local_618 = (undefined1  [16])0x0;
                      local_608 = (undefined1  [16])0x0;
                      local_5f8 = (undefined1  [16])0x0;
                      local_5e8 = (undefined1  [16])0x0;
                      local_5d8 = (undefined1  [16])0x0;
                      local_5c8 = (undefined1  [16])0x0;
                      local_5b8[0] = 0;
                      local_5b8[1] = 0;
                      stack0xfffffffffffffa50 = 0;
                      uStack_5ab = 0;
                      iStack_5a8 = 0;
                      bStack_5a4 = false;
                      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                                ((cpp_dec_float<200u,int,void> *)local_618,0.0);
                      local_6ac = (DataKey)((ulong)local_6ac & 0xffffffff00000000);
                      local_510.data._M_elems[0] = 0;
                      local_510.data._M_elems[1] = 0xffffffff;
                      LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::add((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)local_480,(DataKey *)&local_510,
                            (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)(pnVar3->m_backend).data._M_elems + lVar26),
                            (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)local_698,&local_540,
                            (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)local_618,&local_6ac.info);
                    }
                    goto LAB_004d33fd;
                  }
                  iVar16 = (int)local_6a0;
                  obj((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)local_698,this,iVar16);
                  obj((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)local_618,this,iVar16);
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                  cpp_dec_float<long_long>(&local_510,0,(type *)0x0);
                  local_6a4 = 0;
                  local_6ac.info = 0;
                  local_6ac.idx = -1;
                  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::create((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)local_3b8,&local_6ac,0,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)local_698,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)local_618,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_510,&local_6a4);
                  local_620._0_4_ = cpp_dec_float_finite;
                  local_620._4_4_ = 0x1c;
                  _local_698 = ZEXT816(0);
                  local_688 = ZEXT816(0);
                  local_678 = ZEXT816(0);
                  local_668 = ZEXT816(0);
                  local_658 = ZEXT816(0);
                  local_648 = ZEXT816(0);
                  local_638[0] = 0;
                  local_638[1] = 0;
                  stack0xfffffffffffff9d0 = 0;
                  uStack_62b = 0;
                  uStack_628._0_4_ = 0;
                  uStack_628._4_1_ = false;
                  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                            ((cpp_dec_float<200u,int,void> *)local_698,1.0);
                  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::add((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)local_548,(int)local_6a0,
                        (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)local_698);
                  pnVar24 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)(((this->
                                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ).low.val.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                      _M_elems + lVar26);
                  if (this->thesense == MINIMIZE) {
                    local_620._0_4_ = cpp_dec_float_finite;
                    local_620._4_4_ = 0x1c;
                    _local_698 = ZEXT816(0);
                    local_688 = ZEXT816(0);
                    local_678 = ZEXT816(0);
                    local_668 = ZEXT816(0);
                    local_658 = ZEXT816(0);
                    local_648 = ZEXT816(0);
                    local_638[0] = 0;
                    local_638[1] = 0;
                    stack0xfffffffffffff9d0 = 0;
                    uStack_62b = 0;
                    uStack_628._0_4_ = 0;
                    uStack_628._4_1_ = false;
                    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                              ((cpp_dec_float<200u,int,void> *)local_698,0.0);
                    ::soplex::infinity::__tls_init();
                    local_5a0._0_4_ = cpp_dec_float_finite;
                    local_5a0._4_4_ = 0x1c;
                    _local_618 = ZEXT816(0);
                    local_608 = ZEXT816(0);
                    local_5f8 = ZEXT816(0);
                    local_5e8 = ZEXT816(0);
                    local_5d8 = ZEXT816(0);
                    local_5c8 = ZEXT816(0);
                    local_5b8[0] = 0;
                    local_5b8[1] = 0;
                    stack0xfffffffffffffa50 = 0;
                    uStack_5ab = 0;
                    iStack_5a8 = 0;
                    bStack_5a4 = false;
                    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                              ((cpp_dec_float<200u,int,void> *)local_618,local_568);
                    local_6ac = (DataKey)((ulong)local_6ac & 0xffffffff00000000);
                    local_510.data._M_elems[0] = 0;
                    local_510.data._M_elems[1] = 0xffffffff;
                    LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::add((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)local_480,(DataKey *)&local_510,pnVar24,
                          (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)local_698,&local_540,
                          (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)local_618,&local_6ac.info);
                    pnVar3 = (this->
                             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).up.val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    ::soplex::infinity::__tls_init();
                    local_620._0_4_ = cpp_dec_float_finite;
                    local_620._4_4_ = 0x1c;
                    _local_698 = ZEXT816(0);
                    local_688 = ZEXT816(0);
                    local_678 = ZEXT816(0);
                    local_668 = ZEXT816(0);
                    local_658 = ZEXT816(0);
                    local_648 = ZEXT816(0);
                    local_638[0] = 0;
                    local_638[1] = 0;
                    stack0xfffffffffffff9d0 = 0;
                    uStack_62b = 0;
                    uStack_628._0_4_ = 0;
                    uStack_628._4_1_ = false;
                    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                              ((cpp_dec_float<200u,int,void> *)local_698,local_578);
                    local_5a0._0_4_ = cpp_dec_float_finite;
                    local_5a0._4_4_ = 0x1c;
                    _local_618 = (undefined1  [16])0x0;
                    local_608 = (undefined1  [16])0x0;
                    local_5f8 = (undefined1  [16])0x0;
                    local_5e8 = (undefined1  [16])0x0;
                    local_5d8 = (undefined1  [16])0x0;
                    local_5c8 = (undefined1  [16])0x0;
                    local_5b8[0] = 0;
                    local_5b8[1] = 0;
                    stack0xfffffffffffffa50 = 0;
                    uStack_5ab = 0;
                    iStack_5a8 = 0;
                    bStack_5a4 = false;
                    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                              ((cpp_dec_float<200u,int,void> *)local_618,0.0);
                    local_6ac = (DataKey)((ulong)local_6ac & 0xffffffff00000000);
                    local_510.data._M_elems[0] = 0;
                    local_510.data._M_elems[1] = 0xffffffff;
                    LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::add((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)local_480,(DataKey *)&local_510,
                          (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)(pnVar3->m_backend).data._M_elems + lVar26),
                          (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)local_698,&local_540,
                          (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)local_618,&local_6ac.info);
                  }
                  else {
                    ::soplex::infinity::__tls_init();
                    local_620._0_4_ = cpp_dec_float_finite;
                    local_620._4_4_ = 0x1c;
                    _local_698 = ZEXT816(0);
                    local_688 = ZEXT816(0);
                    local_678 = ZEXT816(0);
                    local_668 = ZEXT816(0);
                    local_658 = ZEXT816(0);
                    local_648 = ZEXT816(0);
                    local_638[0] = 0;
                    local_638[1] = 0;
                    stack0xfffffffffffff9d0 = 0;
                    uStack_62b = 0;
                    uStack_628._0_4_ = 0;
                    uStack_628._4_1_ = false;
                    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                              ((cpp_dec_float<200u,int,void> *)local_698,local_578);
                    local_5a0._0_4_ = cpp_dec_float_finite;
                    local_5a0._4_4_ = 0x1c;
                    _local_618 = ZEXT816(0);
                    local_608 = ZEXT816(0);
                    local_5f8 = ZEXT816(0);
                    local_5e8 = ZEXT816(0);
                    local_5d8 = ZEXT816(0);
                    local_5c8 = ZEXT816(0);
                    local_5b8[0] = 0;
                    local_5b8[1] = 0;
                    stack0xfffffffffffffa50 = 0;
                    uStack_5ab = 0;
                    iStack_5a8 = 0;
                    bStack_5a4 = false;
                    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                              ((cpp_dec_float<200u,int,void> *)local_618,0.0);
                    local_6ac = (DataKey)((ulong)local_6ac & 0xffffffff00000000);
                    local_510.data._M_elems[0] = 0;
                    local_510.data._M_elems[1] = 0xffffffff;
                    LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::add((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)local_480,(DataKey *)&local_510,pnVar24,
                          (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)local_698,&local_540,
                          (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)local_618,&local_6ac.info);
                    pnVar3 = (this->
                             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).up.val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    local_620._0_4_ = cpp_dec_float_finite;
                    local_620._4_4_ = 0x1c;
                    _local_698 = ZEXT816(0);
                    local_688 = ZEXT816(0);
                    local_678 = ZEXT816(0);
                    local_668 = ZEXT816(0);
                    local_658 = ZEXT816(0);
                    local_648 = ZEXT816(0);
                    local_638[0] = 0;
                    local_638[1] = 0;
                    stack0xfffffffffffff9d0 = 0;
                    uStack_62b = 0;
                    uStack_628._0_4_ = 0;
                    uStack_628._4_1_ = false;
                    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                              ((cpp_dec_float<200u,int,void> *)local_698,0.0);
                    ::soplex::infinity::__tls_init();
                    local_5a0._0_4_ = cpp_dec_float_finite;
                    local_5a0._4_4_ = 0x1c;
                    _local_618 = ZEXT816(0);
                    local_608 = ZEXT816(0);
                    local_5f8 = ZEXT816(0);
                    local_5e8 = ZEXT816(0);
                    local_5d8 = ZEXT816(0);
                    local_5c8 = ZEXT816(0);
                    local_5b8[0] = 0;
                    local_5b8[1] = 0;
                    stack0xfffffffffffffa50 = 0;
                    uStack_5ab = 0;
                    iStack_5a8 = 0;
                    bStack_5a4 = false;
                    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                              ((cpp_dec_float<200u,int,void> *)local_618,local_568);
                    local_6ac = (DataKey)((ulong)local_6ac & 0xffffffff00000000);
                    local_510.data._M_elems[0] = 0;
                    local_510.data._M_elems[1] = 0xffffffff;
                    LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::add((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)local_480,(DataKey *)&local_510,
                          (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)(pnVar3->m_backend).data._M_elems + lVar26),
                          (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)local_698,&local_540,
                          (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)local_618,&local_6ac.info);
                  }
                  iVar16 = local_598._0_4_ + 2;
                }
                local_540.memused = 0;
                local_540.m_elem =
                     (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)local_540.m_elem;
                local_540.memsize = local_540.memsize;
                local_598 = (double)CONCAT44(local_598._4_4_,iVar16);
                uVar27 = local_6a0;
              }
              else {
                iVar16 = (int)local_6a0;
                obj((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)local_698,this,iVar16);
                obj((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)local_618,this,iVar16);
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                cpp_dec_float<long_long>(&local_510,0,(type *)0x0);
                local_6a4 = 0;
                local_6ac.info = 0;
                local_6ac.idx = -1;
                LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::create((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)local_3b8,&local_6ac,0,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)local_698,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)local_618,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_510,&local_6a4);
                local_620._0_4_ = cpp_dec_float_finite;
                local_620._4_4_ = 0x1c;
                _local_698 = ZEXT816(0);
                local_688 = ZEXT816(0);
                local_678 = ZEXT816(0);
                local_668 = ZEXT816(0);
                local_658 = ZEXT816(0);
                local_648 = ZEXT816(0);
                local_638[0] = 0;
                local_638[1] = 0;
                stack0xfffffffffffff9d0 = 0;
                uStack_62b = 0;
                uStack_628._0_4_ = 0;
                uStack_628._4_1_ = false;
                boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                          ((cpp_dec_float<200u,int,void> *)local_698,1.0);
                DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::add((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)local_548,(int)local_6a0,
                      (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)local_698);
                pnVar3 = (this->
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).low.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                cpp_dec_float<long_long>((cpp_dec_float<200U,_int,_void> *)local_698,0,(type *)0x0);
                ::soplex::infinity::__tls_init();
                local_5a0._0_4_ = cpp_dec_float_finite;
                local_5a0._4_4_ = 0x1c;
                _local_618 = ZEXT816(0);
                local_608 = ZEXT816(0);
                local_5f8 = ZEXT816(0);
                local_5e8 = ZEXT816(0);
                local_5d8 = ZEXT816(0);
                local_5c8 = ZEXT816(0);
                local_5b8[0] = 0;
                local_5b8[1] = 0;
                stack0xfffffffffffffa50 = 0;
                uStack_5ab = 0;
                iStack_5a8 = 0;
                bStack_5a4 = false;
                boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                          ((cpp_dec_float<200u,int,void> *)local_618,local_568);
                local_6ac = (DataKey)((ulong)local_6ac & 0xffffffff00000000);
                local_510.data._M_elems[0] = 0;
                local_510.data._M_elems[1] = 0xffffffff;
                LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::add((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)local_480,(DataKey *)&local_510,
                      (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)(pnVar3->m_backend).data._M_elems + lVar26),
                      (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)local_698,&local_540,
                      (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)local_618,&local_6ac.info);
                pnVar3 = (this->
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).low.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                ::soplex::infinity::__tls_init();
                local_620._0_4_ = cpp_dec_float_finite;
                local_620._4_4_ = 0x1c;
                _local_698 = ZEXT816(0);
                local_688 = ZEXT816(0);
                local_678 = ZEXT816(0);
                local_668 = ZEXT816(0);
                local_658 = ZEXT816(0);
                local_648 = ZEXT816(0);
                local_638[0] = 0;
                local_638[1] = 0;
                stack0xfffffffffffff9d0 = 0;
                uStack_62b = 0;
                uStack_628._0_4_ = 0;
                uStack_628._4_1_ = false;
                boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                          ((cpp_dec_float<200u,int,void> *)local_698,local_578);
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                cpp_dec_float<long_long>((cpp_dec_float<200U,_int,_void> *)local_618,0,(type *)0x0);
                local_6ac = (DataKey)((ulong)local_6ac & 0xffffffff00000000);
                local_510.data._M_elems[0] = 0;
                local_510.data._M_elems[1] = 0xffffffff;
                LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::add((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)local_480,(DataKey *)&local_510,
                      (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)(pnVar3->m_backend).data._M_elems + lVar26),
                      (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)local_698,&local_540,
                      (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)local_618,&local_6ac.info);
                local_540.memused = 0;
                local_598 = (double)CONCAT44(local_598._4_4_,local_598._0_4_ + 2);
                uVar27 = local_6a0;
              }
            }
            else {
              pnVar3 = (this->
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).low.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              puVar23 = (undefined4 *)((long)(pnVar3->m_backend).data._M_elems + lVar26);
              puVar25 = local_110;
              for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
                *puVar25 = *puVar23;
                puVar23 = puVar23 + (ulong)bVar29 * -2 + 1;
                puVar25 = puVar25 + (ulong)bVar29 * -2 + 1;
              }
              iVar16 = *(int *)((long)(&(pnVar3->m_backend).data + 1) + lVar26);
              bVar2 = *(byte *)((long)(&(pnVar3->m_backend).data + 1) + lVar26 + 4U);
              _local_528 = *(undefined8 *)((long)(&(pnVar3->m_backend).data + 1) + lVar26 + 8U);
              uStack_520 = 0;
              pTVar4 = (this->_tolerances).
                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              p_Var5 = (this->_tolerances).
                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
              if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
                }
              }
              RVar30 = Tolerances::epsilon(pTVar4);
              puVar23 = local_110;
              puVar25 = (undefined4 *)local_618;
              for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
                *puVar25 = *puVar23;
                puVar23 = puVar23 + (ulong)bVar29 * -2 + 1;
                puVar25 = puVar25 + (ulong)bVar29 * -2 + 1;
              }
              fVar12 = local_528;
              uVar14._0_4_ = local_528;
              uVar14._4_4_ = iStack_524;
              local_5a0._0_4_ = local_528;
              local_5a0._4_4_ = iStack_524;
              bStack_5a4 = (bool)bVar2;
              if ((bVar2 != 0) && (local_618._0_4_ != 0 || fVar12 != cpp_dec_float_finite)) {
                bStack_5a4 = (bool)(bVar2 ^ 1);
              }
              bVar15 = false;
              iStack_5a8 = iVar16;
              uVar13 = uVar14;
              if ((fVar12 != cpp_dec_float_NaN) && (uVar13 = local_5a0, !NAN(RVar30))) {
                local_620._0_4_ = cpp_dec_float_finite;
                local_620._4_4_ = 0x1c;
                _local_698 = (undefined1  [16])0x0;
                local_688 = (undefined1  [16])0x0;
                local_678 = (undefined1  [16])0x0;
                local_668 = (undefined1  [16])0x0;
                local_658 = (undefined1  [16])0x0;
                local_648 = (undefined1  [16])0x0;
                local_638[0] = 0;
                local_638[1] = 0;
                stack0xfffffffffffff9d0 = 0;
                uStack_62b = 0;
                uStack_628._0_4_ = 0;
                uStack_628._4_1_ = false;
                local_5a0 = uVar14;
                boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                          ((cpp_dec_float<200u,int,void> *)local_698,RVar30);
                iVar16 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   ((cpp_dec_float<200U,_int,_void> *)local_618,
                                    (cpp_dec_float<200U,_int,_void> *)local_698);
                bVar15 = iVar16 < 1;
                uVar13 = local_5a0;
              }
              local_5a0 = uVar13;
              if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
              }
              if (!bVar15) {
                local_620._0_4_ = cpp_dec_float_finite;
                local_620._4_4_ = 0x1c;
                _local_698 = ZEXT816(0);
                local_688 = ZEXT816(0);
                local_678 = ZEXT816(0);
                local_668 = ZEXT816(0);
                local_658 = ZEXT816(0);
                local_648 = ZEXT816(0);
                local_638[0] = 0;
                local_638[1] = 0;
                stack0xfffffffffffff9d0 = 0;
                uStack_62b = 0;
                uStack_628._0_4_ = 0;
                uStack_628._4_1_ = false;
                boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                          ((cpp_dec_float<200u,int,void> *)local_698,1.0);
                DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::add((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)local_548,(int)local_6a0,
                      (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)local_698);
                iVar16 = (int)local_6a0;
                if (this->thesense == MINIMIZE) {
                  obj((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)local_698,this,iVar16);
                  obj((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)local_618,this,iVar16);
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                  cpp_dec_float<long_long>(&local_510,0,(type *)0x0);
                  local_6a4 = 0;
                  local_6ac.info = 0;
                  local_6ac.idx = -1;
                  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::create((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)local_3b8,&local_6ac,0,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)local_698,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)local_618,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_510,&local_6a4);
                  pnVar3 = (this->
                           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).low.val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  local_620._0_4_ = cpp_dec_float_finite;
                  local_620._4_4_ = 0x1c;
                  _local_698 = ZEXT816(0);
                  local_688 = ZEXT816(0);
                  local_678 = ZEXT816(0);
                  local_668 = ZEXT816(0);
                  local_658 = ZEXT816(0);
                  local_648 = ZEXT816(0);
                  local_638[0] = 0;
                  local_638[1] = 0;
                  stack0xfffffffffffff9d0 = 0;
                  uStack_62b = 0;
                  uStack_628._0_4_ = 0;
                  uStack_628._4_1_ = false;
                  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                            ((cpp_dec_float<200u,int,void> *)local_698,0.0);
                  ::soplex::infinity::__tls_init();
                  local_5a0._0_4_ = cpp_dec_float_finite;
                  local_5a0._4_4_ = 0x1c;
                  _local_618 = ZEXT816(0);
                  local_608 = ZEXT816(0);
                  local_5f8 = ZEXT816(0);
                  local_5e8 = ZEXT816(0);
                  local_5d8 = ZEXT816(0);
                  local_5c8 = ZEXT816(0);
                  local_5b8[0] = 0;
                  local_5b8[1] = 0;
                  stack0xfffffffffffffa50 = 0;
                  uStack_5ab = 0;
                  iStack_5a8 = 0;
                  bStack_5a4 = false;
                  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                            ((cpp_dec_float<200u,int,void> *)local_618,local_568);
                  local_6ac = (DataKey)((ulong)local_6ac & 0xffffffff00000000);
                  local_510.data._M_elems[0] = 0;
                  local_510.data._M_elems[1] = 0xffffffff;
                  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::add((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)local_480,(DataKey *)&local_510,
                        (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)(pnVar3->m_backend).data._M_elems + lVar26),
                        (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)local_698,&local_540,
                        (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)local_618,&local_6ac.info);
                }
                else {
                  obj((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)local_698,this,iVar16);
                  obj((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)local_618,this,iVar16);
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                  cpp_dec_float<long_long>(&local_510,0,(type *)0x0);
                  local_6a4 = 0;
                  local_6ac.info = 0;
                  local_6ac.idx = -1;
                  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::create((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)local_3b8,&local_6ac,0,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)local_698,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)local_618,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_510,&local_6a4);
                  pnVar3 = (this->
                           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).low.val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  ::soplex::infinity::__tls_init();
                  local_620._0_4_ = cpp_dec_float_finite;
                  local_620._4_4_ = 0x1c;
                  _local_698 = ZEXT816(0);
                  local_688 = ZEXT816(0);
                  local_678 = ZEXT816(0);
                  local_668 = ZEXT816(0);
                  local_658 = ZEXT816(0);
                  local_648 = ZEXT816(0);
                  local_638[0] = 0;
                  local_638[1] = 0;
                  stack0xfffffffffffff9d0 = 0;
                  uStack_62b = 0;
                  uStack_628._0_4_ = 0;
                  uStack_628._4_1_ = false;
                  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                            ((cpp_dec_float<200u,int,void> *)local_698,local_578);
                  local_5a0._0_4_ = cpp_dec_float_finite;
                  local_5a0._4_4_ = 0x1c;
                  _local_618 = (undefined1  [16])0x0;
                  local_608 = (undefined1  [16])0x0;
                  local_5f8 = (undefined1  [16])0x0;
                  local_5e8 = (undefined1  [16])0x0;
                  local_5d8 = (undefined1  [16])0x0;
                  local_5c8 = (undefined1  [16])0x0;
                  local_5b8[0] = 0;
                  local_5b8[1] = 0;
                  stack0xfffffffffffffa50 = 0;
                  uStack_5ab = 0;
                  iStack_5a8 = 0;
                  bStack_5a4 = false;
                  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                            ((cpp_dec_float<200u,int,void> *)local_618,0.0);
                  local_6ac = (DataKey)((ulong)local_6ac & 0xffffffff00000000);
                  local_510.data._M_elems[0] = 0;
                  local_510.data._M_elems[1] = 0xffffffff;
                  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::add((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)local_480,(DataKey *)&local_510,
                        (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)(pnVar3->m_backend).data._M_elems + lVar26),
                        (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)local_698,&local_540,
                        (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)local_618,&local_6ac.info);
                }
                goto LAB_004d33fd;
              }
              if (this->thesense == MINIMIZE) {
                ::soplex::infinity::__tls_init();
                local_620._0_4_ = cpp_dec_float_finite;
                local_620._4_4_ = 0x1c;
                _local_698 = ZEXT816(0);
                local_688 = ZEXT816(0);
                local_678 = ZEXT816(0);
                local_668 = ZEXT816(0);
                local_658 = ZEXT816(0);
                local_648 = ZEXT816(0);
                local_638[0] = 0;
                local_638[1] = 0;
                stack0xfffffffffffff9d0 = 0;
                uStack_62b = 0;
                uStack_628._0_4_ = 0;
                uStack_628._4_1_ = false;
                boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                          ((cpp_dec_float<200u,int,void> *)local_698,local_578);
                uVar27 = local_6a0;
                obj((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)local_618,this,(int)local_6a0);
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                cpp_dec_float<long_long>(&local_510,0,(type *)0x0);
                local_6a4 = 0;
                local_6ac.info = 0;
                local_6ac.idx = -1;
                LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::create((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)local_3b8,&local_6ac,0,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)local_698,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)local_618,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_510,&local_6a4);
              }
              else {
                obj((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)local_698,this,(int)local_6a0);
                ::soplex::infinity::__tls_init();
                local_5a0._0_4_ = cpp_dec_float_finite;
                local_5a0._4_4_ = 0x1c;
                _local_618 = ZEXT816(0);
                local_608 = ZEXT816(0);
                local_5f8 = ZEXT816(0);
                local_5e8 = ZEXT816(0);
                local_5d8 = ZEXT816(0);
                local_5c8 = ZEXT816(0);
                local_5b8[0] = 0;
                local_5b8[1] = 0;
                stack0xfffffffffffffa50 = 0;
                uStack_5ab = 0;
                iStack_5a8 = 0;
                bStack_5a4 = false;
                boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                          ((cpp_dec_float<200u,int,void> *)local_618,local_568);
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                cpp_dec_float<long_long>(&local_510,0,(type *)0x0);
                uVar27 = local_6a0;
                local_6a4 = 0;
                local_6ac.info = 0;
                local_6ac.idx = -1;
                LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::create((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)local_3b8,&local_6ac,0,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)local_698,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)local_618,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_510,&local_6a4);
              }
            }
          }
          else {
            pnVar3 = (this->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).up.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            puVar23 = (undefined4 *)((long)(pnVar3->m_backend).data._M_elems + lVar26);
            puVar25 = local_a0;
            for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
              *puVar25 = *puVar23;
              puVar23 = puVar23 + (ulong)bVar29 * -2 + 1;
              puVar25 = puVar25 + (ulong)bVar29 * -2 + 1;
            }
            iVar16 = *(int *)((long)(&(pnVar3->m_backend).data + 1) + lVar26);
            bVar2 = *(byte *)((long)(&(pnVar3->m_backend).data + 1) + lVar26 + 4U);
            _local_528 = *(undefined8 *)((long)(&(pnVar3->m_backend).data + 1) + lVar26 + 8U);
            uStack_520 = 0;
            pTVar4 = (this->_tolerances).
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            p_Var5 = (this->_tolerances).
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi;
            if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
              }
            }
            RVar30 = Tolerances::epsilon(pTVar4);
            puVar23 = local_a0;
            puVar25 = (undefined4 *)local_618;
            for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
              *puVar25 = *puVar23;
              puVar23 = puVar23 + (ulong)bVar29 * -2 + 1;
              puVar25 = puVar25 + (ulong)bVar29 * -2 + 1;
            }
            fVar12 = local_528;
            uVar13._0_4_ = local_528;
            uVar13._4_4_ = iStack_524;
            local_5a0._0_4_ = local_528;
            local_5a0._4_4_ = iStack_524;
            bStack_5a4 = (bool)bVar2;
            if ((bVar2 != 0) && (local_618._0_4_ != 0 || fVar12 != cpp_dec_float_finite)) {
              bStack_5a4 = (bool)(bVar2 ^ 1);
            }
            bVar15 = false;
            iStack_5a8 = iVar16;
            uVar14 = uVar13;
            if ((fVar12 != cpp_dec_float_NaN) && (uVar14 = local_5a0, !NAN(RVar30))) {
              local_620._0_4_ = cpp_dec_float_finite;
              local_620._4_4_ = 0x1c;
              _local_698 = (undefined1  [16])0x0;
              local_688 = (undefined1  [16])0x0;
              local_678 = (undefined1  [16])0x0;
              local_668 = (undefined1  [16])0x0;
              local_658 = (undefined1  [16])0x0;
              local_648 = (undefined1  [16])0x0;
              local_638[0] = 0;
              local_638[1] = 0;
              stack0xfffffffffffff9d0 = 0;
              uStack_62b = 0;
              uStack_628._0_4_ = 0;
              uStack_628._4_1_ = false;
              local_5a0 = uVar13;
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)local_698,RVar30);
              iVar16 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)local_618,
                                  (cpp_dec_float<200U,_int,_void> *)local_698);
              bVar15 = iVar16 < 1;
              uVar14 = local_5a0;
            }
            local_5a0 = uVar14;
            if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
            }
            if (!bVar15) {
              local_620._0_4_ = cpp_dec_float_finite;
              local_620._4_4_ = 0x1c;
              _local_698 = ZEXT816(0);
              local_688 = ZEXT816(0);
              local_678 = ZEXT816(0);
              local_668 = ZEXT816(0);
              local_658 = ZEXT816(0);
              local_648 = ZEXT816(0);
              local_638[0] = 0;
              local_638[1] = 0;
              stack0xfffffffffffff9d0 = 0;
              uStack_62b = 0;
              uStack_628._0_4_ = 0;
              uStack_628._4_1_ = false;
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)local_698,1.0);
              DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::add((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)local_548,(int)local_6a0,
                    (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)local_698);
              iVar16 = (int)local_6a0;
              if (this->thesense == MINIMIZE) {
                obj((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)local_698,this,iVar16);
                obj((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)local_618,this,iVar16);
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                cpp_dec_float<long_long>(&local_510,0,(type *)0x0);
                local_6a4 = 0;
                local_6ac.info = 0;
                local_6ac.idx = -1;
                LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::create((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)local_3b8,&local_6ac,0,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)local_698,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)local_618,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_510,&local_6a4);
                pnVar3 = (this->
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).up.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                ::soplex::infinity::__tls_init();
                local_620._0_4_ = cpp_dec_float_finite;
                local_620._4_4_ = 0x1c;
                _local_698 = ZEXT816(0);
                local_688 = ZEXT816(0);
                local_678 = ZEXT816(0);
                local_668 = ZEXT816(0);
                local_658 = ZEXT816(0);
                local_648 = ZEXT816(0);
                local_638[0] = 0;
                local_638[1] = 0;
                stack0xfffffffffffff9d0 = 0;
                uStack_62b = 0;
                uStack_628._0_4_ = 0;
                uStack_628._4_1_ = false;
                boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                          ((cpp_dec_float<200u,int,void> *)local_698,local_578);
                local_5a0._0_4_ = cpp_dec_float_finite;
                local_5a0._4_4_ = 0x1c;
                _local_618 = (undefined1  [16])0x0;
                local_608 = (undefined1  [16])0x0;
                local_5f8 = (undefined1  [16])0x0;
                local_5e8 = (undefined1  [16])0x0;
                local_5d8 = (undefined1  [16])0x0;
                local_5c8 = (undefined1  [16])0x0;
                local_5b8[0] = 0;
                local_5b8[1] = 0;
                stack0xfffffffffffffa50 = 0;
                uStack_5ab = 0;
                iStack_5a8 = 0;
                bStack_5a4 = false;
                boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                          ((cpp_dec_float<200u,int,void> *)local_618,0.0);
                local_6ac = (DataKey)((ulong)local_6ac & 0xffffffff00000000);
                local_510.data._M_elems[0] = 0;
                local_510.data._M_elems[1] = 0xffffffff;
                LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::add((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)local_480,(DataKey *)&local_510,
                      (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)(pnVar3->m_backend).data._M_elems + lVar26),
                      (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)local_698,&local_540,
                      (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)local_618,&local_6ac.info);
              }
              else {
                obj((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)local_698,this,iVar16);
                obj((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)local_618,this,iVar16);
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                cpp_dec_float<long_long>(&local_510,0,(type *)0x0);
                local_6a4 = 0;
                local_6ac.info = 0;
                local_6ac.idx = -1;
                LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::create((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)local_3b8,&local_6ac,0,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)local_698,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)local_618,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_510,&local_6a4);
                pnVar3 = (this->
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).up.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                local_620._0_4_ = cpp_dec_float_finite;
                local_620._4_4_ = 0x1c;
                _local_698 = ZEXT816(0);
                local_688 = ZEXT816(0);
                local_678 = ZEXT816(0);
                local_668 = ZEXT816(0);
                local_658 = ZEXT816(0);
                local_648 = ZEXT816(0);
                local_638[0] = 0;
                local_638[1] = 0;
                stack0xfffffffffffff9d0 = 0;
                uStack_62b = 0;
                uStack_628._0_4_ = 0;
                uStack_628._4_1_ = false;
                boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                          ((cpp_dec_float<200u,int,void> *)local_698,0.0);
                ::soplex::infinity::__tls_init();
                local_5a0._0_4_ = cpp_dec_float_finite;
                local_5a0._4_4_ = 0x1c;
                _local_618 = ZEXT816(0);
                local_608 = ZEXT816(0);
                local_5f8 = ZEXT816(0);
                local_5e8 = ZEXT816(0);
                local_5d8 = ZEXT816(0);
                local_5c8 = ZEXT816(0);
                local_5b8[0] = 0;
                local_5b8[1] = 0;
                stack0xfffffffffffffa50 = 0;
                uStack_5ab = 0;
                iStack_5a8 = 0;
                bStack_5a4 = false;
                boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                          ((cpp_dec_float<200u,int,void> *)local_618,local_568);
                local_6ac = (DataKey)((ulong)local_6ac & 0xffffffff00000000);
                local_510.data._M_elems[0] = 0;
                local_510.data._M_elems[1] = 0xffffffff;
                LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::add((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)local_480,(DataKey *)&local_510,
                      (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)(pnVar3->m_backend).data._M_elems + lVar26),
                      (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)local_698,&local_540,
                      (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)local_618,&local_6ac.info);
              }
              goto LAB_004d33fd;
            }
            if (this->thesense == MINIMIZE) {
              obj((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)local_698,this,(int)local_6a0);
              ::soplex::infinity::__tls_init();
              local_5a0._0_4_ = cpp_dec_float_finite;
              local_5a0._4_4_ = 0x1c;
              _local_618 = ZEXT816(0);
              local_608 = ZEXT816(0);
              local_5f8 = ZEXT816(0);
              local_5e8 = ZEXT816(0);
              local_5d8 = ZEXT816(0);
              local_5c8 = ZEXT816(0);
              local_5b8[0] = 0;
              local_5b8[1] = 0;
              stack0xfffffffffffffa50 = 0;
              uStack_5ab = 0;
              iStack_5a8 = 0;
              bStack_5a4 = false;
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)local_618,local_568);
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>(&local_510,0,(type *)0x0);
              uVar27 = local_6a0;
              local_6a4 = 0;
              local_6ac.info = 0;
              local_6ac.idx = -1;
              LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::create((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)local_3b8,&local_6ac,0,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)local_698,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)local_618,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_510,&local_6a4);
            }
            else {
              ::soplex::infinity::__tls_init();
              local_620._0_4_ = cpp_dec_float_finite;
              local_620._4_4_ = 0x1c;
              _local_698 = ZEXT816(0);
              local_688 = ZEXT816(0);
              local_678 = ZEXT816(0);
              local_668 = ZEXT816(0);
              local_658 = ZEXT816(0);
              local_648 = ZEXT816(0);
              local_638[0] = 0;
              local_638[1] = 0;
              stack0xfffffffffffff9d0 = 0;
              uStack_62b = 0;
              uStack_628._0_4_ = 0;
              uStack_628._4_1_ = false;
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)local_698,local_578);
              uVar27 = local_6a0;
              obj((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)local_618,this,(int)local_6a0);
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>(&local_510,0,(type *)0x0);
              local_6a4 = 0;
              local_6ac.info = 0;
              local_6ac.idx = -1;
              LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::create((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)local_3b8,&local_6ac,0,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)local_698,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)local_618,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_510,&local_6a4);
            }
          }
        }
        else {
          pnVar3 = (this->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).up.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ::soplex::infinity::__tls_init();
          local_5a0._0_4_ = cpp_dec_float_finite;
          local_5a0._4_4_ = 0x1c;
          _local_618 = (undefined1  [16])0x0;
          local_608 = (undefined1  [16])0x0;
          local_5f8 = (undefined1  [16])0x0;
          local_5e8 = (undefined1  [16])0x0;
          local_5d8 = (undefined1  [16])0x0;
          local_5c8 = (undefined1  [16])0x0;
          local_5b8[0] = 0;
          local_5b8[1] = 0;
          stack0xfffffffffffffa50 = 0;
          uStack_5ab = 0;
          iStack_5a8 = 0;
          bStack_5a4 = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)local_618,local_568);
          if (((*(int *)((long)(&(pnVar3->m_backend).data + 1) + lVar26 + 8U) == 2) ||
              ((fpclass_type)local_5a0 == cpp_dec_float_NaN)) ||
             (iVar16 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)
                                  ((long)(pnVar3->m_backend).data._M_elems + lVar26),
                                  (cpp_dec_float<200U,_int,_void> *)local_618), uVar27 = local_6a0,
             iVar16 < 0)) goto LAB_004d101b;
          iVar16 = (int)local_6a0;
          obj((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)local_698,this,iVar16);
          obj((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)local_618,this,iVar16);
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                    (&local_510,0,(type *)0x0);
          local_6a4 = 0;
          local_6ac.info = 0;
          local_6ac.idx = -1;
          LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::create((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)local_3b8,&local_6ac,0,
                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)local_698,
                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)local_618,
                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_510,&local_6a4);
        }
        uVar27 = uVar27 + 1;
        lVar26 = lVar26 + 0x80;
      } while ((long)uVar27 <
               (long)(this->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thenum);
      local_6a0 = (ulong)local_598._0_4_;
    }
    (*(local_580->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[8])(local_580,local_3b8,0);
    iVar16 = (int)uVar27;
    if (iVar16 != 0) {
      uVar21 = 0;
      do {
        pDVar1 = (local_580->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thekey + uVar21;
        local_618._0_4_ = pDVar1->info;
        local_618._4_4_ = pDVar1->idx;
        SPxRowId::SPxRowId((SPxRowId *)local_698,(DataKey *)local_618);
        auVar10 = _local_698;
        pDVar1 = (DataKey *)((local_558->m_backend).data._M_elems + uVar21 * 2);
        pDVar1->info = local_698._0_4_;
        pDVar1->idx = local_698._4_4_;
        uVar21 = uVar21 + 1;
        _local_698 = auVar10;
      } while ((uVar27 & 0xffffffff) != uVar21);
    }
    *nprimalcols = iVar16;
    *ndualrows = iVar16;
    if ((this->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .set.thenum < 1) {
      uVar28 = 0;
    }
    else {
      local_598 = *(double *)(in_FS_OFFSET + -8);
      uStack_590 = 0;
      local_568 = -local_598;
      uStack_560 = 0x8000000000000000;
      lVar26 = 0;
      lVar19 = 0;
      uVar28 = 0;
      local_588 = this;
      do {
        TVar17 = LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::type(&this->
                         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ,(int)lVar19);
        switch(TVar17) {
        case LESS_EQUAL:
          pDVar1 = (this->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thekey + lVar19;
          local_618._0_4_ = pDVar1->info;
          local_618._4_4_ = pDVar1->idx;
          SPxRowId::SPxRowId((SPxRowId *)local_698,(DataKey *)local_618);
          auVar10 = _local_698;
          local_550[(int)uVar28].super_DataKey.info = local_698._0_4_;
          local_550[(int)uVar28].super_DataKey.idx = local_698._4_4_;
          uVar28 = uVar28 + 1;
          pnVar24 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)(((this->
                                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).right.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems
                       + lVar26);
          if (this->thesense == MINIMIZE) {
            _local_698 = auVar10;
            ::soplex::infinity::__tls_init();
            local_578 = (double)CONCAT44(local_578._4_4_,uVar28);
            local_620._0_4_ = cpp_dec_float_finite;
            local_620._4_4_ = 0x1c;
            _local_698 = (undefined1  [16])0x0;
            local_688 = (undefined1  [16])0x0;
            local_678 = (undefined1  [16])0x0;
            local_668 = (undefined1  [16])0x0;
            local_658 = (undefined1  [16])0x0;
            local_648 = (undefined1  [16])0x0;
            local_638[0] = 0;
            local_638[1] = 0;
            stack0xfffffffffffff9d0 = 0;
            uStack_62b = 0;
            uStack_628._0_4_ = 0;
            uStack_628._4_1_ = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)local_698,local_568);
            pIVar6 = (local_588->
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.theitem;
            iVar16 = (local_588->
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thekey[lVar19].idx;
            local_5a0._0_4_ = cpp_dec_float_finite;
            local_5a0._4_4_ = 0x1c;
            _local_618 = (undefined1  [16])0x0;
            local_608 = (undefined1  [16])0x0;
            local_5f8 = (undefined1  [16])0x0;
            local_5e8 = (undefined1  [16])0x0;
            local_5d8 = (undefined1  [16])0x0;
            local_5c8 = (undefined1  [16])0x0;
            local_5b8[0] = 0;
            local_5b8[1] = 0;
            stack0xfffffffffffffa50 = 0;
            uStack_5ab = 0;
            iStack_5a8 = 0;
            bStack_5a4 = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)local_618,0.0);
            local_6ac = (DataKey)((ulong)local_6ac & 0xffffffff00000000);
            local_510.data._M_elems[0] = 0;
            local_510.data._M_elems[1] = 0xffffffff;
            LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::add((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)local_480,(DataKey *)&local_510,pnVar24,
                  (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)local_698,
                  (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)(pIVar6 + iVar16),
                  (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)local_618,&local_6ac.info);
LAB_004d45b6:
            this = local_588;
            uVar28 = local_578._0_4_;
          }
          else {
            local_620._0_4_ = cpp_dec_float_finite;
            local_620._4_4_ = 0x1c;
            _local_698 = (undefined1  [16])0x0;
            local_688 = (undefined1  [16])0x0;
            local_678 = (undefined1  [16])0x0;
            local_668 = (undefined1  [16])0x0;
            local_658 = (undefined1  [16])0x0;
            local_648 = (undefined1  [16])0x0;
            local_638[0] = 0;
            local_638[1] = 0;
            stack0xfffffffffffff9d0 = 0;
            uStack_62b = 0;
            uStack_628._0_4_ = 0;
            uStack_628._4_1_ = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)local_698,0.0);
            iVar16 = (this->
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thekey[lVar19].idx;
            pIVar6 = (this->
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.theitem;
            ::soplex::infinity::__tls_init();
            local_5a0._0_4_ = cpp_dec_float_finite;
            local_5a0._4_4_ = 0x1c;
            _local_618 = (undefined1  [16])0x0;
            local_608 = (undefined1  [16])0x0;
            local_5f8 = (undefined1  [16])0x0;
            local_5e8 = (undefined1  [16])0x0;
            local_5d8 = (undefined1  [16])0x0;
            local_5c8 = (undefined1  [16])0x0;
            local_5b8[0] = 0;
            local_5b8[1] = 0;
            stack0xfffffffffffffa50 = 0;
            uStack_5ab = 0;
            iStack_5a8 = 0;
            bStack_5a4 = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)local_618,local_598);
            local_6ac = (DataKey)((ulong)local_6ac & 0xffffffff00000000);
            local_510.data._M_elems[0] = 0;
            local_510.data._M_elems[1] = 0xffffffff;
            LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::add((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)local_480,(DataKey *)&local_510,pnVar24,
                  (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)local_698,
                  (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)(pIVar6 + iVar16),
                  (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)local_618,&local_6ac.info);
            this = local_588;
          }
          break;
        case EQUAL:
          local_618 = *(undefined1 (*) [8])
                       ((this->
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .set.thekey + lVar19);
          SPxRowId::SPxRowId((SPxRowId *)local_698,(DataKey *)local_618);
          auVar10 = _local_698;
          local_550[(int)uVar28].super_DataKey.info = local_698._0_4_;
          local_550[(int)uVar28].super_DataKey.idx = local_698._4_4_;
          pnVar3 = (this->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).right.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          _local_698 = auVar10;
          ::soplex::infinity::__tls_init();
          local_620._0_4_ = cpp_dec_float_finite;
          local_620._4_4_ = 0x1c;
          _local_698 = (undefined1  [16])0x0;
          local_688 = (undefined1  [16])0x0;
          local_678 = (undefined1  [16])0x0;
          local_668 = (undefined1  [16])0x0;
          local_658 = (undefined1  [16])0x0;
          local_648 = (undefined1  [16])0x0;
          local_638[0] = 0;
          local_638[1] = 0;
          stack0xfffffffffffff9d0 = 0;
          uStack_62b = 0;
          uStack_628._0_4_ = 0;
          uStack_628._4_1_ = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)local_698,local_568);
          iVar16 = (this->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thekey[lVar19].idx;
          pIVar6 = (this->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.theitem;
          ::soplex::infinity::__tls_init();
          local_5a0._0_4_ = cpp_dec_float_finite;
          local_5a0._4_4_ = 0x1c;
          _local_618 = ZEXT816(0);
          local_608 = ZEXT816(0);
          local_5f8 = ZEXT816(0);
          local_5e8 = ZEXT816(0);
          local_5d8 = ZEXT816(0);
          local_5c8 = ZEXT816(0);
          local_5b8[0] = 0;
          local_5b8[1] = 0;
          stack0xfffffffffffffa50 = 0;
          uStack_5ab = 0;
          iStack_5a8 = 0;
          bStack_5a4 = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)local_618,local_598);
          local_6ac = (DataKey)((ulong)local_6ac & 0xffffffff00000000);
          local_510.data._M_elems[0] = 0;
          local_510.data._M_elems[1] = 0xffffffff;
          LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::add((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)local_480,(DataKey *)&local_510,
                (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)(pnVar3->m_backend).data._M_elems + lVar26),
                (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)local_698,
                (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)(pIVar6 + iVar16),
                (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)local_618,&local_6ac.info);
          uVar28 = uVar28 + 1;
          this = local_588;
          break;
        case GREATER_EQUAL:
          pDVar1 = (this->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thekey + lVar19;
          local_618._0_4_ = pDVar1->info;
          local_618._4_4_ = pDVar1->idx;
          SPxRowId::SPxRowId((SPxRowId *)local_698,(DataKey *)local_618);
          auVar10 = _local_698;
          local_550[(int)uVar28].super_DataKey.info = local_698._0_4_;
          local_550[(int)uVar28].super_DataKey.idx = local_698._4_4_;
          uVar28 = uVar28 + 1;
          pnVar24 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)(((this->
                                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).left.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems
                       + lVar26);
          if (this->thesense != MINIMIZE) {
            _local_698 = auVar10;
            ::soplex::infinity::__tls_init();
            local_578 = (double)CONCAT44(local_578._4_4_,uVar28);
            local_620._0_4_ = cpp_dec_float_finite;
            local_620._4_4_ = 0x1c;
            _local_698 = (undefined1  [16])0x0;
            local_688 = (undefined1  [16])0x0;
            local_678 = (undefined1  [16])0x0;
            local_668 = (undefined1  [16])0x0;
            local_658 = (undefined1  [16])0x0;
            local_648 = (undefined1  [16])0x0;
            local_638[0] = 0;
            local_638[1] = 0;
            stack0xfffffffffffff9d0 = 0;
            uStack_62b = 0;
            uStack_628._0_4_ = 0;
            uStack_628._4_1_ = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)local_698,local_568);
            pIVar6 = (local_588->
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.theitem;
            iVar16 = (local_588->
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thekey[lVar19].idx;
            local_5a0._0_4_ = cpp_dec_float_finite;
            local_5a0._4_4_ = 0x1c;
            _local_618 = (undefined1  [16])0x0;
            local_608 = (undefined1  [16])0x0;
            local_5f8 = (undefined1  [16])0x0;
            local_5e8 = (undefined1  [16])0x0;
            local_5d8 = (undefined1  [16])0x0;
            local_5c8 = (undefined1  [16])0x0;
            local_5b8[0] = 0;
            local_5b8[1] = 0;
            stack0xfffffffffffffa50 = 0;
            uStack_5ab = 0;
            iStack_5a8 = 0;
            bStack_5a4 = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)local_618,0.0);
            local_6ac = (DataKey)((ulong)local_6ac & 0xffffffff00000000);
            local_510.data._M_elems[0] = 0;
            local_510.data._M_elems[1] = 0xffffffff;
            LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::add((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)local_480,(DataKey *)&local_510,pnVar24,
                  (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)local_698,
                  (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)(pIVar6 + iVar16),
                  (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)local_618,&local_6ac.info);
            goto LAB_004d45b6;
          }
          local_620._0_4_ = cpp_dec_float_finite;
          local_620._4_4_ = 0x1c;
          _local_698 = (undefined1  [16])0x0;
          local_688 = (undefined1  [16])0x0;
          local_678 = (undefined1  [16])0x0;
          local_668 = (undefined1  [16])0x0;
          local_658 = (undefined1  [16])0x0;
          local_648 = (undefined1  [16])0x0;
          local_638[0] = 0;
          local_638[1] = 0;
          stack0xfffffffffffff9d0 = 0;
          uStack_62b = 0;
          uStack_628._0_4_ = 0;
          uStack_628._4_1_ = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)local_698,0.0);
          iVar16 = (this->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thekey[lVar19].idx;
          pIVar6 = (this->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.theitem;
          ::soplex::infinity::__tls_init();
          local_5a0._0_4_ = cpp_dec_float_finite;
          local_5a0._4_4_ = 0x1c;
          _local_618 = (undefined1  [16])0x0;
          local_608 = (undefined1  [16])0x0;
          local_5f8 = (undefined1  [16])0x0;
          local_5e8 = (undefined1  [16])0x0;
          local_5d8 = (undefined1  [16])0x0;
          local_5c8 = (undefined1  [16])0x0;
          local_5b8[0] = 0;
          local_5b8[1] = 0;
          stack0xfffffffffffffa50 = 0;
          uStack_5ab = 0;
          iStack_5a8 = 0;
          bStack_5a4 = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)local_618,local_598);
          local_6ac = (DataKey)((ulong)local_6ac & 0xffffffff00000000);
          local_510.data._M_elems[0] = 0;
          local_510.data._M_elems[1] = 0xffffffff;
          LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::add((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)local_480,(DataKey *)&local_510,pnVar24,
                (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)local_698,
                (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)(pIVar6 + iVar16),
                (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)local_618,&local_6ac.info);
          this = local_588;
          break;
        case RANGE:
          local_578 = (double)CONCAT44(local_578._4_4_,uVar28);
          if (this->thesense == MINIMIZE) {
            pDVar1 = (this->
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thekey + lVar19;
            local_618._0_4_ = pDVar1->info;
            local_618._4_4_ = pDVar1->idx;
            SPxRowId::SPxRowId((SPxRowId *)local_698,(DataKey *)local_618);
            local_550[(int)uVar28].super_DataKey.info = local_698._0_4_;
            local_550[(int)uVar28].super_DataKey.idx = local_698._4_4_;
            pnVar3 = (this->
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).left.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_620._0_4_ = cpp_dec_float_finite;
            local_620._4_4_ = 0x1c;
            _local_698 = (undefined1  [16])0x0;
            local_688 = (undefined1  [16])0x0;
            local_678 = (undefined1  [16])0x0;
            local_668 = (undefined1  [16])0x0;
            local_658 = (undefined1  [16])0x0;
            local_648 = (undefined1  [16])0x0;
            local_638[0] = 0;
            local_638[1] = 0;
            stack0xfffffffffffff9d0 = 0;
            uStack_62b = 0;
            uStack_628._0_4_ = 0;
            uStack_628._4_1_ = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)local_698,0.0);
            iVar16 = (this->
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thekey[lVar19].idx;
            pIVar6 = (this->
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.theitem;
            local_558 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)(long)(int)uVar28;
            ::soplex::infinity::__tls_init();
            local_5a0._0_4_ = cpp_dec_float_finite;
            local_5a0._4_4_ = 0x1c;
            _local_618 = (undefined1  [16])0x0;
            local_608 = (undefined1  [16])0x0;
            local_5f8 = (undefined1  [16])0x0;
            local_5e8 = (undefined1  [16])0x0;
            local_5d8 = (undefined1  [16])0x0;
            local_5c8 = (undefined1  [16])0x0;
            local_5b8[0] = 0;
            local_5b8[1] = 0;
            stack0xfffffffffffffa50 = 0;
            uStack_5ab = 0;
            iStack_5a8 = 0;
            bStack_5a4 = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)local_618,local_598);
            local_6ac = (DataKey)((ulong)local_6ac & 0xffffffff00000000);
            local_510.data._M_elems[0] = 0;
            local_510.data._M_elems[1] = 0xffffffff;
            LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::add((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)local_480,(DataKey *)&local_510,
                  (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)(pnVar3->m_backend).data._M_elems + lVar26),
                  (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)local_698,
                  (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)(pIVar6 + iVar16),
                  (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)local_618,&local_6ac.info);
            this = local_588;
            pDVar1 = (local_588->
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thekey + lVar19;
            local_618._0_4_ = pDVar1->info;
            local_618._4_4_ = pDVar1->idx;
            SPxRowId::SPxRowId((SPxRowId *)local_698,(DataKey *)local_618);
            auVar10 = _local_698;
            local_550[(long)local_558 + 1].super_DataKey.info = local_698._0_4_;
            local_550[(long)local_558 + 1].super_DataKey.idx = local_698._4_4_;
            local_558 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)(((this->
                                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).right.val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                  _M_elems + lVar26);
            _local_698 = auVar10;
            ::soplex::infinity::__tls_init();
            local_620._0_4_ = cpp_dec_float_finite;
            local_620._4_4_ = 0x1c;
            _local_698 = ZEXT816(0);
            local_688 = ZEXT816(0);
            local_678 = ZEXT816(0);
            local_668 = ZEXT816(0);
            local_658 = ZEXT816(0);
            local_648 = ZEXT816(0);
            local_638[0] = 0;
            local_638[1] = 0;
            stack0xfffffffffffff9d0 = 0;
            uStack_62b = 0;
            uStack_628._0_4_ = 0;
            uStack_628._4_1_ = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)local_698,local_568);
            pIVar6 = (this->
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.theitem;
            iVar16 = (this->
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thekey[lVar19].idx;
            local_5a0._0_4_ = cpp_dec_float_finite;
            local_5a0._4_4_ = 0x1c;
            _local_618 = (undefined1  [16])0x0;
            local_608 = (undefined1  [16])0x0;
            local_5f8 = (undefined1  [16])0x0;
            local_5e8 = (undefined1  [16])0x0;
            local_5d8 = (undefined1  [16])0x0;
            local_5c8 = (undefined1  [16])0x0;
            local_5b8[0] = 0;
            local_5b8[1] = 0;
            stack0xfffffffffffffa50 = 0;
            uStack_5ab = 0;
            iStack_5a8 = 0;
            bStack_5a4 = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)local_618,0.0);
            local_6ac = (DataKey)((ulong)local_6ac & 0xffffffff00000000);
            local_510.data._M_elems[0] = 0;
            local_510.data._M_elems[1] = 0xffffffff;
            LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::add((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)local_480,(DataKey *)&local_510,local_558,
                  (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)local_698,
                  (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)(pIVar6 + iVar16),
                  (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)local_618,&local_6ac.info);
            uVar28 = local_578._0_4_ + 2;
          }
          else {
            local_618 = *(undefined1 (*) [8])
                         ((this->
                          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thekey + lVar19);
            SPxRowId::SPxRowId((SPxRowId *)local_698,(DataKey *)local_618);
            auVar10 = _local_698;
            local_558 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)(long)(int)uVar28;
            local_550[(long)local_558].super_DataKey.info = local_698._0_4_;
            local_550[(long)local_558].super_DataKey.idx = local_698._4_4_;
            pnVar3 = (this->
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).left.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            _local_698 = auVar10;
            ::soplex::infinity::__tls_init();
            local_620._0_4_ = cpp_dec_float_finite;
            local_620._4_4_ = 0x1c;
            _local_698 = (undefined1  [16])0x0;
            local_688 = (undefined1  [16])0x0;
            local_678 = (undefined1  [16])0x0;
            local_668 = (undefined1  [16])0x0;
            local_658 = (undefined1  [16])0x0;
            local_648 = (undefined1  [16])0x0;
            local_638[0] = 0;
            local_638[1] = 0;
            stack0xfffffffffffff9d0 = 0;
            uStack_62b = 0;
            uStack_628._0_4_ = 0;
            uStack_628._4_1_ = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)local_698,local_568);
            pIVar6 = (local_588->
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.theitem;
            iVar16 = (local_588->
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thekey[lVar19].idx;
            local_5a0._0_4_ = cpp_dec_float_finite;
            local_5a0._4_4_ = 0x1c;
            _local_618 = ZEXT816(0);
            local_608 = ZEXT816(0);
            local_5f8 = ZEXT816(0);
            local_5e8 = ZEXT816(0);
            local_5d8 = ZEXT816(0);
            local_5c8 = ZEXT816(0);
            local_5b8[0] = 0;
            local_5b8[1] = 0;
            stack0xfffffffffffffa50 = 0;
            uStack_5ab = 0;
            iStack_5a8 = 0;
            bStack_5a4 = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)local_618,0.0);
            local_6ac = (DataKey)((ulong)local_6ac & 0xffffffff00000000);
            local_510.data._M_elems[0] = 0;
            local_510.data._M_elems[1] = 0xffffffff;
            LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::add((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)local_480,(DataKey *)&local_510,
                  (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)(pnVar3->m_backend).data._M_elems + lVar26),
                  (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)local_698,
                  (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)(pIVar6 + iVar16),
                  (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)local_618,&local_6ac.info);
            pSVar11 = local_588;
            local_618 = (undefined1  [8])
                        (local_588->
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .set.thekey[lVar19];
            SPxRowId::SPxRowId((SPxRowId *)local_698,(DataKey *)local_618);
            iVar20 = local_578._0_4_;
            local_550[(long)((long)(local_558->m_backend).data._M_elems + 1)].super_DataKey.info =
                 local_698._0_4_;
            local_550[(long)((long)(local_558->m_backend).data._M_elems + 1)].super_DataKey.idx =
                 local_698._4_4_;
            pnVar3 = (pSVar11->
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).right.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_620._0_4_ = cpp_dec_float_finite;
            local_620._4_4_ = 0x1c;
            _local_698 = ZEXT816(0);
            local_688 = ZEXT816(0);
            local_678 = ZEXT816(0);
            local_668 = ZEXT816(0);
            local_658 = ZEXT816(0);
            local_648 = ZEXT816(0);
            local_638[0] = 0;
            local_638[1] = 0;
            stack0xfffffffffffff9d0 = 0;
            uStack_62b = 0;
            uStack_628._0_4_ = 0;
            uStack_628._4_1_ = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)local_698,0.0);
            iVar16 = (pSVar11->
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thekey[lVar19].idx;
            pIVar6 = (pSVar11->
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.theitem;
            ::soplex::infinity::__tls_init();
            local_5a0._0_4_ = cpp_dec_float_finite;
            local_5a0._4_4_ = 0x1c;
            _local_618 = ZEXT816(0);
            local_608 = ZEXT816(0);
            local_5f8 = ZEXT816(0);
            local_5e8 = ZEXT816(0);
            local_5d8 = ZEXT816(0);
            local_5c8 = ZEXT816(0);
            local_5b8[0] = 0;
            local_5b8[1] = 0;
            stack0xfffffffffffffa50 = 0;
            uStack_5ab = 0;
            iStack_5a8 = 0;
            bStack_5a4 = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)local_618,local_598);
            local_6ac = (DataKey)((ulong)local_6ac & 0xffffffff00000000);
            local_510.data._M_elems[0] = 0;
            local_510.data._M_elems[1] = 0xffffffff;
            LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::add((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)local_480,(DataKey *)&local_510,
                  (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)(pnVar3->m_backend).data._M_elems + lVar26),
                  (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)local_698,
                  (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)(pIVar6 + iVar16),
                  (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)local_618,&local_6ac.info);
            uVar28 = iVar20 + 2;
            this = local_588;
          }
          break;
        default:
          puVar18 = (undefined8 *)__cxa_allocate_exception(0x28);
          local_698 = (undefined1  [8])local_688;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_698,"XLPFRD01 This should never happen.","");
          *puVar18 = &PTR__SPxException_0069d438;
          puVar18[1] = puVar18 + 3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(puVar18 + 1),local_698,
                     (undefined1 *)((long)pSStack_690 + (long)local_698));
          *puVar18 = &PTR__SPxException_0069d410;
          __cxa_throw(puVar18,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
        }
        lVar19 = lVar19 + 1;
        lVar26 = lVar26 + 0x80;
      } while (lVar19 < (this->
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .set.thenum);
    }
    pSVar11 = local_580;
    (*(local_580->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0xd])(local_580,local_480,0);
    if (0 < (int)uVar28) {
      local_6a0 = local_6a0 << 3;
      uVar27 = 0;
      do {
        local_618 = (undefined1  [8])
                    *(undefined8 *)
                     ((long)&(pSVar11->
                             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).
                             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .set.thekey[uVar27].info + local_6a0);
        SPxColId::SPxColId((SPxColId *)local_698,(DataKey *)local_618);
        auVar10 = _local_698;
        local_488[uVar27].super_DataKey.info = local_698._0_4_;
        local_488[uVar27].super_DataKey.idx = local_698._4_4_;
        uVar27 = uVar27 + 1;
        _local_698 = auVar10;
      } while (uVar28 != uVar27);
    }
    *nprimalrows = uVar28;
    *ndualcols = uVar28;
    local_548 = (undefined1  [8])&PTR__DSVectorBase_006a69e0;
    if (local_530 !=
        (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)0x0) {
      free(local_530);
    }
    LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::~LPColSetBase((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)local_480);
    LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::~LPRowSetBase((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)local_3b8);
  }
  return;
}

Assistant:

inline
void SPxLPBase<R>::buildDualProblem(SPxLPBase<R>& dualLP, SPxRowId primalRowIds[],
                                    SPxColId primalColIds[],
                                    SPxRowId dualRowIds[], SPxColId dualColIds[], int* nprimalrows, int* nprimalcols, int* ndualrows,
                                    int* ndualcols)
{
   // Setting up the primalrowids and dualcolids arrays if not given as parameters
   if(primalRowIds == nullptr || primalColIds == nullptr || dualRowIds == nullptr
         || dualColIds == nullptr)
   {
      DataArray < SPxRowId > primalrowids(2 * nRows());
      DataArray < SPxColId > primalcolids(2 * nCols());
      DataArray < SPxRowId > dualrowids(2 * nCols());
      DataArray < SPxColId > dualcolids(2 * nRows());
      int numprimalrows = 0;
      int numprimalcols = 0;
      int numdualrows = 0;
      int numdualcols = 0;

      buildDualProblem(dualLP, primalrowids.get_ptr(), primalcolids.get_ptr(), dualrowids.get_ptr(),
                       dualcolids.get_ptr(), &numprimalrows, &numprimalcols, &numdualrows, &numdualcols);

      if(primalRowIds != nullptr)
      {
         primalRowIds = primalrowids.get_ptr();
         (*nprimalrows) = numprimalrows;
      }

      if(primalColIds != nullptr)
      {
         primalColIds = primalcolids.get_ptr();
         (*nprimalcols) = numprimalcols;
      }

      if(dualRowIds != nullptr)
      {
         dualRowIds = dualrowids.get_ptr();
         (*ndualrows) = numdualrows;
      }

      if(dualColIds != nullptr)
      {
         dualColIds = dualcolids.get_ptr();
         (*ndualcols) = numdualcols;
      }

      return;
   }

   // setting the sense of the dual LP
   if(spxSense() == MINIMIZE)
      dualLP.changeSense(MAXIMIZE);
   else
      dualLP.changeSense(MINIMIZE);

   LPRowSetBase<R> dualrows(nCols());
   LPColSetBase<R> dualcols(nRows());
   DSVectorBase<R> col(1);

   int numAddedRows = 0;
   int numVarBoundCols = 0;
   int primalrowsidx = 0;
   int primalcolsidx = 0;

   for(int i = 0; i < nCols(); ++i)
   {
      primalColIds[primalcolsidx] = cId(i);
      primalcolsidx++;

      if(lower(i) <= R(-infinity) && upper(i) >= R(infinity))   // unrestricted variables
      {
         dualrows.create(0, obj(i), obj(i));
         numAddedRows++;
      }
      else if(lower(i) <= R(-infinity))   // no lower bound is set, indicating a <= 0 variable
      {
         if(isZero(upper(i), this->tolerances()->epsilon()))   // standard bound variable
         {
            if(spxSense() == MINIMIZE)
               dualrows.create(0, obj(i), R(infinity));
            else
               dualrows.create(0, R(-infinity), obj(i));
         }
         else // additional upper bound on the variable
         {
            col.add(numAddedRows, 1.0);

            if(spxSense() == MINIMIZE)
            {
               dualrows.create(0, obj(i), obj(i));
               dualcols.add(upper(i), R(-infinity), col, 0.0);
            }
            else
            {
               dualrows.create(0, obj(i), obj(i));
               dualcols.add(upper(i), 0.0, col, R(infinity));
            }

            col.clear();

            numVarBoundCols++;
         }

         numAddedRows++;
      }
      else if(upper(i) >= R(infinity))   // no upper bound set, indicating a >= 0 variable
      {
         if(isZero(lower(i), this->tolerances()->epsilon()))   // standard bound variable
         {
            if(spxSense() == MINIMIZE)
               dualrows.create(0, R(-infinity), obj(i));
            else
               dualrows.create(0, obj(i), R(infinity));
         }
         else // additional lower bound on the variable
         {
            col.add(numAddedRows, 1.0);

            if(spxSense() == MINIMIZE)
            {
               dualrows.create(0, obj(i), obj(i));
               dualcols.add(lower(i), 0.0, col, R(infinity));
            }
            else
            {
               dualrows.create(0, obj(i), obj(i));
               dualcols.add(lower(i), R(-infinity), col, 0.0);
            }

            col.clear();

            numVarBoundCols++;
         }

         numAddedRows++;
      }
      else if(NE(lower(i), upper(i), this->tolerances()->epsilon()))   // a boxed variable
      {
         if(isZero(lower(i), this->tolerances()->epsilon()))   // variable bounded between 0 and upper(i)
         {
            col.add(numAddedRows, 1.0);

            if(spxSense() == MINIMIZE)
            {
               dualrows.create(0, R(-infinity), obj(i));
               dualcols.add(upper(i), R(-infinity), col, 0.0);
            }
            else
            {
               dualrows.create(0, obj(i), R(infinity));
               dualcols.add(upper(i), 0.0, col, R(infinity));
            }

            col.clear();

            numVarBoundCols++;
         }
         else if(isZero(upper(i),
                        this->tolerances()->epsilon()))   // variable bounded between lower(i) and 0
         {
            col.add(numAddedRows, 1.0);

            if(spxSense() == MINIMIZE)
            {
               dualrows.create(0, obj(i), R(infinity));
               dualcols.add(lower(i), 0.0, col, R(infinity));
            }
            else
            {
               dualrows.create(0, R(-infinity), obj(i));
               dualcols.add(lower(i), R(-infinity), col, 0.0);
            }

            col.clear();

            numVarBoundCols++;
         }
         else // variable bounded between lower(i) and upper(i)
         {
            dualrows.create(0, obj(i), obj(i));

            col.add(numAddedRows, 1.0);

            if(spxSense() == MINIMIZE)
            {
               dualcols.add(lower(i), 0.0, col, R(infinity));
               dualcols.add(upper(i), R(-infinity), col, 0.0);
            }
            else
            {
               dualcols.add(lower(i), R(-infinity), col, 0.0);
               dualcols.add(upper(i), 0.0, col, R(infinity));
            }

            col.clear();

            numVarBoundCols += 2;
         }

         numAddedRows++;
      }
      else
      {
         assert(lower(i) == upper(i));

         dualrows.create(0, obj(i), obj(i));

         col.add(numAddedRows, 1.0);
         dualcols.add(lower(i), 0, col, R(infinity));
         dualcols.add(lower(i), R(-infinity), col, 0);
         col.clear();

         numVarBoundCols += 2;
         numAddedRows++;
      }
   }

   // adding the empty rows to the dual LP
   dualLP.addRows(dualrows);

   // setting the dual row ids for the related primal cols.
   // this assumes that the rows are added in sequential order.
   for(int i = 0; i < primalcolsidx; i++)
      dualRowIds[i] = dualLP.rId(i);

   (*nprimalcols) = primalcolsidx;
   (*ndualrows) = primalcolsidx;

   // iterating over each of the rows to create dual columns
   for(int i = 0; i < nRows(); ++i)
   {
      // checking the type of the row
      switch(rowType(i))
      {
      case LPRowBase<R>::RANGE: // range constraint, requires the addition of two dual variables
         assert(lhs(i) > R(-infinity));
         assert(rhs(i) < R(infinity));

         if(spxSense() == MINIMIZE)
         {
            primalRowIds[primalrowsidx] = rId(i); // setting the rowid for the primal row
            primalrowsidx++;
            dualcols.add(lhs(i), 0.0, rowVector(i), R(infinity));

            primalRowIds[primalrowsidx] = rId(i); // setting the rowid for the primal row
            primalrowsidx++;
            dualcols.add(rhs(i), R(-infinity), rowVector(i), 0.0);
         }
         else
         {
            primalRowIds[primalrowsidx] = rId(i); // setting the rowid for the primal row
            primalrowsidx++;
            dualcols.add(lhs(i), R(-infinity), rowVector(i), 0.0);

            primalRowIds[primalrowsidx] = rId(i); // setting the rowid for the primal row
            primalrowsidx++;
            dualcols.add(rhs(i), 0.0, rowVector(i), R(infinity));
         }

         break;

      case LPRowBase<R>::GREATER_EQUAL: // >= constraint
         assert(lhs(i) > R(-infinity));
         primalRowIds[primalrowsidx] = rId(i); // setting the rowid for the primal row
         primalrowsidx++;

         if(spxSense() == MINIMIZE)
            dualcols.add(lhs(i), 0.0, rowVector(i), R(infinity));
         else
            dualcols.add(lhs(i), R(-infinity), rowVector(i), 0.0);

         break;

      case LPRowBase<R>::LESS_EQUAL: // <= constriant
         assert(rhs(i) < R(infinity));
         primalRowIds[primalrowsidx] = rId(i); // setting the rowid for the primal row
         primalrowsidx++;

         if(spxSense() == MINIMIZE)
            dualcols.add(rhs(i), R(-infinity), rowVector(i), 0.0);
         else
            dualcols.add(rhs(i), 0.0, rowVector(i), R(infinity));

         break;

      case LPRowBase<R>::EQUAL: // Equality constraint
         assert(EQ(lhs(i), rhs(i), this->tolerances()->epsilon()));
         primalRowIds[primalrowsidx] = rId(i); // setting the rowid for the primal row
         primalrowsidx++;
         dualcols.add(rhs(i), R(-infinity), rowVector(i), R(infinity));
         break;

      default:
         throw SPxInternalCodeException("XLPFRD01 This should never happen.");
      }
   }

   // adding the filled columns to the dual LP
   dualLP.addCols(dualcols);

   // setting the dual column ids for the related primal rows.
   // this assumes that the columns are added in sequential order.
   for(int i = 0; i < primalrowsidx; i++)
      dualColIds[i] = dualLP.cId(i + numVarBoundCols);

   (*nprimalrows) = primalrowsidx;
   (*ndualcols) = primalrowsidx;
}